

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiMBIntersector1<4>::
     occluded_h<embree::sse2::RibbonCurve1Intersector1<embree::HermiteCurveT,4>,embree::sse2::Occluded1EpilogMU<4,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Scene **ppSVar5;
  float *pfVar6;
  Scene **ppSVar7;
  RTCRayQueryFlags *pRVar8;
  Primitive *pPVar9;
  undefined1 (*pauVar10) [16];
  undefined4 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  Primitive PVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  Geometry *pGVar26;
  __int_type_conflict _Var27;
  long lVar28;
  RTCFilterFunctionN p_Var29;
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [16];
  undefined6 uVar71;
  undefined1 auVar72 [12];
  unkbyte9 Var73;
  undefined1 auVar74 [13];
  undefined1 auVar75 [12];
  undefined1 auVar76 [13];
  undefined1 auVar77 [12];
  undefined1 auVar78 [13];
  undefined1 auVar79 [12];
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  undefined1 auVar82 [13];
  undefined1 auVar83 [12];
  undefined1 auVar84 [13];
  undefined1 auVar85 [12];
  undefined1 auVar86 [12];
  undefined1 auVar87 [12];
  undefined1 auVar88 [12];
  undefined1 auVar89 [12];
  undefined1 auVar90 [12];
  undefined1 auVar91 [12];
  undefined1 auVar92 [12];
  undefined1 auVar93 [12];
  undefined1 auVar94 [15];
  bool bVar95;
  bool bVar96;
  bool bVar97;
  bool bVar98;
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [13];
  undefined1 auVar106 [15];
  RayQueryContext *pRVar107;
  ulong uVar108;
  long lVar109;
  ulong uVar110;
  RTCIntersectArguments *pRVar111;
  ulong uVar112;
  undefined1 auVar113 [8];
  RayQueryContext *extraout_RDX;
  RayQueryContext *extraout_RDX_00;
  RayQueryContext *pRVar114;
  RayQueryContext *extraout_RDX_01;
  RayQueryContext *extraout_RDX_02;
  long lVar115;
  undefined4 uVar116;
  undefined8 unaff_RBP;
  RTCIntersectArguments *pRVar118;
  long lVar119;
  long lVar120;
  byte bVar121;
  uint uVar122;
  uint uVar123;
  uint uVar124;
  uint uVar125;
  uint uVar126;
  short sVar127;
  float fVar128;
  undefined1 auVar132 [12];
  float fVar183;
  undefined1 auVar137 [16];
  char cVar187;
  undefined1 auVar139 [16];
  undefined1 auVar133 [12];
  undefined1 auVar143 [16];
  undefined1 auVar134 [12];
  undefined1 auVar147 [16];
  float fVar188;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar135 [12];
  undefined1 auVar156 [16];
  undefined1 auVar136 [12];
  undefined1 auVar160 [16];
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar164 [16];
  undefined1 auVar167 [16];
  undefined1 auVar170 [16];
  undefined1 auVar173 [16];
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined8 uVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar178;
  float fVar196;
  float fVar197;
  float fVar217;
  float fVar219;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar202 [16];
  undefined1 auVar205 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar218;
  float fVar220;
  float fVar221;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar215;
  undefined1 auVar216 [16];
  int iVar222;
  int iVar223;
  int iVar224;
  char cVar247;
  undefined1 uVar248;
  int iVar249;
  undefined1 auVar228 [16];
  char cVar250;
  undefined1 auVar232 [16];
  undefined1 auVar236 [16];
  undefined1 auVar240 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar251;
  float fVar259;
  float fVar261;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar260;
  float fVar262;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  char cVar279;
  float fVar263;
  float fVar280;
  float fVar281;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar282;
  undefined1 uVar291;
  float fVar292;
  undefined1 auVar283 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  float fVar293;
  float fVar294;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  float fVar307;
  float fVar308;
  float fVar309;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar310;
  float fVar319;
  undefined1 auVar311 [12];
  undefined1 auVar312 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar318;
  float fVar323;
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  float fVar324;
  float fVar326;
  float fVar327;
  undefined1 auVar325 [16];
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar336;
  float fVar339;
  float fVar341;
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  float fVar337;
  float fVar338;
  float fVar340;
  float fVar342;
  undefined1 auVar335 [16];
  float fVar343;
  float fVar348;
  float fVar349;
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  float fVar356;
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  float fVar357;
  float fVar358;
  float fVar362;
  float fVar364;
  float fVar366;
  undefined1 auVar359 [16];
  float fVar363;
  float fVar365;
  float fVar367;
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar373;
  float fVar375;
  float fVar376;
  float fVar378;
  float fVar379;
  float fVar380;
  undefined1 auVar371 [16];
  float fVar374;
  float fVar377;
  float fVar381;
  undefined1 auVar372 [16];
  float fVar382;
  float fVar383;
  char local_488;
  char cStack_487;
  undefined1 uStack_486;
  undefined1 uStack_485;
  short local_468;
  undefined2 uStack_466;
  undefined2 uStack_464;
  undefined2 uStack_462;
  short local_458;
  undefined2 uStack_456;
  undefined2 uStack_454;
  undefined2 uStack_452;
  undefined4 local_448;
  undefined2 uStack_444;
  undefined2 uStack_442;
  int local_40c;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_408;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined4 local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  RayQueryContext *local_3b0;
  undefined1 local_3a8 [8];
  undefined8 uStack_3a0;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  long local_380;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  RTCIntersectArguments *local_350;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  Precalculations *local_330;
  undefined8 local_328;
  undefined8 uStack_320;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  RTCFilterFunctionNArguments args;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  undefined8 local_2a8;
  float local_2a0;
  float local_29c;
  float local_298;
  undefined4 local_294;
  undefined4 local_290;
  uint local_28c;
  uint local_288;
  RayQueryContext *local_270;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  Primitive *local_170;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_4> bhit;
  ulong uVar117;
  undefined1 auVar153 [16];
  undefined1 auVar157 [16];
  undefined1 auVar161 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar140 [16];
  undefined1 auVar144 [16];
  undefined1 auVar148 [16];
  undefined1 auVar154 [16];
  undefined1 auVar158 [16];
  undefined1 auVar162 [16];
  undefined1 auVar138 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar149 [16];
  undefined1 auVar155 [16];
  undefined1 auVar159 [16];
  undefined1 auVar163 [16];
  undefined2 uVar179;
  int iVar180;
  int iVar181;
  int iVar182;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar225 [12];
  undefined1 auVar226 [12];
  undefined1 auVar227 [12];
  undefined1 auVar233 [16];
  undefined1 auVar237 [16];
  undefined1 auVar241 [16];
  undefined1 auVar231 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar242 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  float fVar320;
  
  PVar19 = prim[1];
  uVar108 = (ulong)(byte)PVar19;
  lVar119 = uVar108 * 0x25;
  uVar116 = *(undefined4 *)(prim + uVar108 * 4 + 6);
  uVar20 = *(undefined4 *)(prim + uVar108 * 5 + 6);
  uVar21 = *(undefined4 *)(prim + uVar108 * 6 + 6);
  uVar11 = *(undefined4 *)(prim + uVar108 * 0xf + 6);
  uVar22 = *(undefined4 *)(prim + (ulong)(byte)PVar19 * 0x10 + 6);
  uVar23 = *(undefined4 *)(prim + uVar108 * 0x11 + 6);
  uVar24 = *(undefined4 *)(prim + uVar108 * 0x1a + 6);
  uVar25 = *(undefined4 *)(prim + uVar108 * 0x1b + 6);
  pPVar9 = prim + lVar119 + 6;
  fVar339 = *(float *)(pPVar9 + 0xc);
  fVar196 = ((ray->org).field_0.m128[0] - *(float *)pPVar9) * fVar339;
  fVar217 = ((ray->org).field_0.m128[1] - *(float *)(pPVar9 + 4)) * fVar339;
  fVar219 = ((ray->org).field_0.m128[2] - *(float *)(pPVar9 + 8)) * fVar339;
  fVar329 = fVar339 * (ray->dir).field_0.m128[0];
  fVar336 = fVar339 * (ray->dir).field_0.m128[1];
  fVar339 = fVar339 * (ray->dir).field_0.m128[2];
  uVar248 = (undefined1)((uint)uVar20 >> 0x18);
  uVar179 = CONCAT11(uVar248,uVar248);
  uVar248 = (undefined1)((uint)uVar20 >> 0x10);
  uVar192 = CONCAT35(CONCAT21(uVar179,uVar248),CONCAT14(uVar248,uVar20));
  cVar247 = (char)((uint)uVar20 >> 8);
  uVar71 = CONCAT51(CONCAT41((int)((ulong)uVar192 >> 0x20),cVar247),cVar247);
  cVar187 = (char)uVar20;
  uVar117 = CONCAT62(uVar71,CONCAT11(cVar187,cVar187));
  auVar230._8_4_ = 0;
  auVar230._0_8_ = uVar117;
  auVar230._12_2_ = uVar179;
  auVar230._14_2_ = uVar179;
  uVar179 = (undefined2)((ulong)uVar192 >> 0x20);
  auVar229._12_4_ = auVar230._12_4_;
  auVar229._8_2_ = 0;
  auVar229._0_8_ = uVar117;
  auVar229._10_2_ = uVar179;
  auVar228._10_6_ = auVar229._10_6_;
  auVar228._8_2_ = uVar179;
  auVar228._0_8_ = uVar117;
  uVar179 = (undefined2)uVar71;
  auVar72._4_8_ = auVar228._8_8_;
  auVar72._2_2_ = uVar179;
  auVar72._0_2_ = uVar179;
  iVar222 = (int)CONCAT11(cVar187,cVar187) >> 8;
  iVar249 = auVar72._0_4_ >> 0x18;
  auVar225._0_8_ = CONCAT44(iVar249,iVar222);
  auVar225._8_4_ = auVar228._8_4_ >> 0x18;
  auVar231._12_4_ = auVar229._12_4_ >> 0x18;
  auVar231._0_12_ = auVar225;
  fVar323 = (float)iVar249;
  cVar250 = cVar247 >> 7;
  auVar30[0xd] = 0;
  auVar30._0_13_ = auVar231._0_13_;
  auVar30[0xe] = cVar250;
  auVar35[0xc] = cVar250;
  auVar35._0_12_ = auVar225;
  auVar35._13_2_ = auVar30._13_2_;
  auVar40[0xb] = 0;
  auVar40._0_11_ = auVar225._0_11_;
  auVar40._12_3_ = auVar35._12_3_;
  auVar45[10] = cVar250;
  auVar45._0_10_ = auVar225._0_10_;
  auVar45._11_4_ = auVar40._11_4_;
  auVar50[9] = 0;
  auVar50._0_9_ = auVar225._0_9_;
  auVar50._10_5_ = auVar45._10_5_;
  auVar55[8] = cVar247;
  auVar55._0_8_ = auVar225._0_8_;
  auVar55._9_6_ = auVar50._9_6_;
  Var73 = CONCAT81(CONCAT71(auVar55._8_7_,(char)((uint)uVar21 >> 0x18)),(short)cVar187 >> 7);
  auVar60._6_9_ = Var73;
  auVar60[5] = (char)((uint)uVar21 >> 0x10);
  auVar60[4] = (undefined1)((short)cVar187 >> 7);
  auVar60._0_4_ = iVar222;
  cVar250 = (char)((uint)uVar21 >> 8);
  auVar74._2_11_ = auVar60._4_11_;
  auVar74[1] = cVar250;
  auVar74[0] = (undefined1)((short)cVar187 >> 7);
  cVar247 = (char)uVar21;
  auVar65._2_13_ = auVar74;
  auVar65._0_2_ = CONCAT11(cVar247,cVar187);
  uVar179 = (undefined2)Var73;
  auVar234._0_12_ = auVar65._0_12_;
  auVar234._12_2_ = uVar179;
  auVar234._14_2_ = uVar179;
  auVar233._12_4_ = auVar234._12_4_;
  auVar233._0_10_ = auVar65._0_10_;
  auVar233._10_2_ = auVar60._4_2_;
  auVar232._10_6_ = auVar233._10_6_;
  auVar232._0_8_ = auVar65._0_8_;
  auVar232._8_2_ = auVar60._4_2_;
  auVar75._4_8_ = auVar232._8_8_;
  auVar75._2_2_ = auVar74._0_2_;
  auVar75._0_2_ = auVar74._0_2_;
  iVar223 = (int)CONCAT11(cVar247,cVar187) >> 8;
  iVar249 = auVar75._0_4_ >> 0x18;
  auVar226._0_8_ = CONCAT44(iVar249,iVar223);
  auVar226._8_4_ = auVar232._8_4_ >> 0x18;
  auVar235._12_4_ = auVar233._12_4_ >> 0x18;
  auVar235._0_12_ = auVar226;
  fVar356 = (float)iVar249;
  cVar187 = cVar250 >> 7;
  auVar31[0xd] = 0;
  auVar31._0_13_ = auVar235._0_13_;
  auVar31[0xe] = cVar187;
  auVar36[0xc] = cVar187;
  auVar36._0_12_ = auVar226;
  auVar36._13_2_ = auVar31._13_2_;
  auVar41[0xb] = 0;
  auVar41._0_11_ = auVar226._0_11_;
  auVar41._12_3_ = auVar36._12_3_;
  auVar46[10] = cVar187;
  auVar46._0_10_ = auVar226._0_10_;
  auVar46._11_4_ = auVar41._11_4_;
  auVar51[9] = 0;
  auVar51._0_9_ = auVar226._0_9_;
  auVar51._10_5_ = auVar46._10_5_;
  auVar56[8] = cVar250;
  auVar56._0_8_ = auVar226._0_8_;
  auVar56._9_6_ = auVar51._9_6_;
  Var73 = CONCAT81(CONCAT71(auVar56._8_7_,(char)((uint)uVar22 >> 0x18)),(short)cVar247 >> 7);
  auVar61._6_9_ = Var73;
  auVar61[5] = (char)((uint)uVar22 >> 0x10);
  auVar61[4] = (undefined1)((short)cVar247 >> 7);
  auVar61._0_4_ = iVar223;
  cVar279 = (char)((uint)uVar22 >> 8);
  auVar76._2_11_ = auVar61._4_11_;
  auVar76[1] = cVar279;
  auVar76[0] = (undefined1)((short)cVar247 >> 7);
  cVar250 = (char)uVar22;
  auVar66._2_13_ = auVar76;
  auVar66._0_2_ = CONCAT11(cVar250,cVar247);
  uVar179 = (undefined2)Var73;
  auVar238._0_12_ = auVar66._0_12_;
  auVar238._12_2_ = uVar179;
  auVar238._14_2_ = uVar179;
  auVar237._12_4_ = auVar238._12_4_;
  auVar237._0_10_ = auVar66._0_10_;
  auVar237._10_2_ = auVar61._4_2_;
  auVar236._10_6_ = auVar237._10_6_;
  auVar236._0_8_ = auVar66._0_8_;
  auVar236._8_2_ = auVar61._4_2_;
  auVar77._4_8_ = auVar236._8_8_;
  auVar77._2_2_ = auVar76._0_2_;
  auVar77._0_2_ = auVar76._0_2_;
  iVar224 = (int)CONCAT11(cVar250,cVar247) >> 8;
  iVar249 = auVar77._0_4_ >> 0x18;
  auVar227._0_8_ = CONCAT44(iVar249,iVar224);
  auVar227._8_4_ = auVar236._8_4_ >> 0x18;
  auVar239._12_4_ = auVar237._12_4_ >> 0x18;
  auVar239._0_12_ = auVar227;
  fVar319 = (float)iVar249;
  cVar187 = cVar279 >> 7;
  auVar32[0xd] = 0;
  auVar32._0_13_ = auVar239._0_13_;
  auVar32[0xe] = cVar187;
  auVar37[0xc] = cVar187;
  auVar37._0_12_ = auVar227;
  auVar37._13_2_ = auVar32._13_2_;
  auVar42[0xb] = 0;
  auVar42._0_11_ = auVar227._0_11_;
  auVar42._12_3_ = auVar37._12_3_;
  auVar47[10] = cVar187;
  auVar47._0_10_ = auVar227._0_10_;
  auVar47._11_4_ = auVar42._11_4_;
  auVar52[9] = 0;
  auVar52._0_9_ = auVar227._0_9_;
  auVar52._10_5_ = auVar47._10_5_;
  auVar57[8] = cVar279;
  auVar57._0_8_ = auVar227._0_8_;
  auVar57._9_6_ = auVar52._9_6_;
  Var73 = CONCAT81(CONCAT71(auVar57._8_7_,(char)((uint)uVar23 >> 0x18)),(short)cVar250 >> 7);
  auVar62._6_9_ = Var73;
  auVar62[5] = (char)((uint)uVar23 >> 0x10);
  auVar62[4] = (undefined1)((short)cVar250 >> 7);
  auVar62._0_4_ = iVar224;
  auVar78._2_11_ = auVar62._4_11_;
  auVar78[1] = (char)((uint)uVar23 >> 8);
  auVar78[0] = (undefined1)((short)cVar250 >> 7);
  sVar127 = CONCAT11((char)uVar23,cVar250);
  auVar67._2_13_ = auVar78;
  auVar67._0_2_ = sVar127;
  uVar179 = (undefined2)Var73;
  auVar242._0_12_ = auVar67._0_12_;
  auVar242._12_2_ = uVar179;
  auVar242._14_2_ = uVar179;
  auVar241._12_4_ = auVar242._12_4_;
  auVar241._0_10_ = auVar67._0_10_;
  auVar241._10_2_ = auVar62._4_2_;
  auVar240._10_6_ = auVar241._10_6_;
  auVar240._0_8_ = auVar67._0_8_;
  auVar240._8_2_ = auVar62._4_2_;
  auVar79._4_8_ = auVar240._8_8_;
  auVar79._2_2_ = auVar78._0_2_;
  auVar79._0_2_ = auVar78._0_2_;
  fVar293 = (float)((int)sVar127 >> 8);
  fVar297 = (float)(auVar79._0_4_ >> 0x18);
  fVar300 = (float)(auVar240._8_4_ >> 0x18);
  uVar20 = *(undefined4 *)(prim + uVar108 * 0x1c + 6);
  local_3e8 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar119 + 0x16)) *
              *(float *)(prim + lVar119 + 0x1a);
  _local_398 = ZEXT416((uint)local_3e8);
  local_488 = (char)uVar116;
  cStack_487 = (char)((uint)uVar116 >> 8);
  uStack_486 = (undefined1)((uint)uVar116 >> 0x10);
  uStack_485 = (undefined1)((uint)uVar116 >> 0x18);
  uVar179 = CONCAT11(uStack_485,(char)((uint)local_3e8 >> 0x18));
  uVar192 = CONCAT35(CONCAT21(uVar179,uStack_486),
                     CONCAT14((char)((uint)local_3e8 >> 0x10),local_3e8));
  uVar71 = CONCAT51(CONCAT41((int)((ulong)uVar192 >> 0x20),cStack_487),(char)((uint)local_3e8 >> 8))
  ;
  sVar127 = CONCAT11(local_488,SUB41(local_3e8,0));
  uVar117 = CONCAT62(uVar71,sVar127);
  auVar137._8_4_ = 0;
  auVar137._0_8_ = uVar117;
  auVar137._12_2_ = uVar179;
  auVar137._14_2_ = uVar179;
  uVar179 = (undefined2)((ulong)uVar192 >> 0x20);
  auVar253._12_4_ = auVar137._12_4_;
  auVar253._8_2_ = 0;
  auVar253._0_8_ = uVar117;
  auVar253._10_2_ = uVar179;
  auVar198._10_6_ = auVar253._10_6_;
  auVar198._8_2_ = uVar179;
  auVar198._0_8_ = uVar117;
  uVar179 = (undefined2)uVar71;
  auVar80._4_8_ = auVar198._8_8_;
  auVar80._2_2_ = uVar179;
  auVar80._0_2_ = uVar179;
  iVar249 = (int)sVar127 >> 8;
  iVar180 = auVar80._0_4_ >> 0x18;
  auVar132._0_8_ = CONCAT44(iVar180,iVar249);
  auVar132._8_4_ = auVar198._8_4_ >> 0x18;
  auVar138._12_4_ = auVar253._12_4_ >> 0x18;
  auVar138._0_12_ = auVar132;
  fVar307 = (float)iVar180;
  local_3c8._0_1_ = (char)uVar11;
  local_3c8._1_1_ = (char)((uint)uVar11 >> 8);
  local_3c8._2_1_ = (undefined1)((uint)uVar11 >> 0x10);
  local_3c8._3_1_ = (undefined1)((uint)uVar11 >> 0x18);
  cVar187 = cStack_487 >> 7;
  auVar94[0xd] = 0;
  auVar94._0_13_ = auVar138._0_13_;
  auVar94[0xe] = cVar187;
  auVar99[0xc] = cVar187;
  auVar99._0_12_ = auVar132;
  auVar99._13_2_ = auVar94._13_2_;
  auVar100[0xb] = 0;
  auVar100._0_11_ = auVar132._0_11_;
  auVar100._12_3_ = auVar99._12_3_;
  auVar101[10] = cVar187;
  auVar101._0_10_ = auVar132._0_10_;
  auVar101._11_4_ = auVar100._11_4_;
  auVar102[9] = 0;
  auVar102._0_9_ = auVar132._0_9_;
  auVar102._10_5_ = auVar101._10_5_;
  auVar103[8] = cStack_487;
  auVar103._0_8_ = auVar132._0_8_;
  auVar103._9_6_ = auVar102._9_6_;
  Var73 = CONCAT81(CONCAT71(auVar103._8_7_,local_3c8._3_1_),(short)local_488 >> 7);
  auVar104._6_9_ = Var73;
  auVar104[5] = local_3c8._2_1_;
  auVar104[4] = (undefined1)((short)local_488 >> 7);
  auVar104._0_4_ = iVar249;
  auVar105._2_11_ = auVar104._4_11_;
  auVar105[1] = local_3c8._1_1_;
  auVar105[0] = (undefined1)((short)local_488 >> 7);
  auVar106._2_13_ = auVar105;
  auVar106._0_2_ = CONCAT11((char)local_3c8,local_488);
  uVar179 = (undefined2)Var73;
  auVar141._0_12_ = auVar106._0_12_;
  auVar141._12_2_ = uVar179;
  auVar141._14_2_ = uVar179;
  auVar140._12_4_ = auVar141._12_4_;
  auVar140._0_10_ = auVar106._0_10_;
  auVar140._10_2_ = auVar104._4_2_;
  auVar139._10_6_ = auVar140._10_6_;
  auVar139._0_8_ = auVar106._0_8_;
  auVar139._8_2_ = auVar104._4_2_;
  auVar81._4_8_ = auVar139._8_8_;
  auVar81._2_2_ = auVar105._0_2_;
  auVar81._0_2_ = auVar105._0_2_;
  iVar180 = (int)CONCAT11((char)local_3c8,local_488) >> 8;
  iVar181 = auVar81._0_4_ >> 0x18;
  auVar133._0_8_ = CONCAT44(iVar181,iVar180);
  auVar133._8_4_ = auVar139._8_4_ >> 0x18;
  auVar142._12_4_ = auVar140._12_4_ >> 0x18;
  auVar142._0_12_ = auVar133;
  fVar259 = (float)iVar181;
  cVar187 = local_3c8._1_1_ >> 7;
  auVar33[0xd] = 0;
  auVar33._0_13_ = auVar142._0_13_;
  auVar33[0xe] = cVar187;
  auVar38[0xc] = cVar187;
  auVar38._0_12_ = auVar133;
  auVar38._13_2_ = auVar33._13_2_;
  auVar43[0xb] = 0;
  auVar43._0_11_ = auVar133._0_11_;
  auVar43._12_3_ = auVar38._12_3_;
  auVar48[10] = cVar187;
  auVar48._0_10_ = auVar133._0_10_;
  auVar48._11_4_ = auVar43._11_4_;
  auVar53[9] = 0;
  auVar53._0_9_ = auVar133._0_9_;
  auVar53._10_5_ = auVar48._10_5_;
  auVar58[8] = local_3c8._1_1_;
  auVar58._0_8_ = auVar133._0_8_;
  auVar58._9_6_ = auVar53._9_6_;
  uVar291 = (undefined1)((uint)uVar24 >> 0x18);
  Var73 = CONCAT81(CONCAT71(auVar58._8_7_,uVar291),(short)(char)local_3c8 >> 7);
  uVar248 = (undefined1)((uint)uVar24 >> 0x10);
  auVar63._6_9_ = Var73;
  auVar63[5] = uVar248;
  auVar63[4] = (undefined1)((short)(char)local_3c8 >> 7);
  auVar63._0_4_ = iVar180;
  cVar250 = (char)((uint)uVar24 >> 8);
  auVar82._2_11_ = auVar63._4_11_;
  auVar82[1] = cVar250;
  auVar82[0] = (undefined1)((short)(char)local_3c8 >> 7);
  cVar247 = (char)uVar24;
  auVar68._2_13_ = auVar82;
  auVar68._0_2_ = CONCAT11(cVar247,(char)local_3c8);
  uVar179 = (undefined2)Var73;
  auVar145._0_12_ = auVar68._0_12_;
  auVar145._12_2_ = uVar179;
  auVar145._14_2_ = uVar179;
  auVar144._12_4_ = auVar145._12_4_;
  auVar144._0_10_ = auVar68._0_10_;
  auVar144._10_2_ = auVar63._4_2_;
  auVar143._10_6_ = auVar144._10_6_;
  auVar143._0_8_ = auVar68._0_8_;
  auVar143._8_2_ = auVar63._4_2_;
  auVar83._4_8_ = auVar143._8_8_;
  auVar83._2_2_ = auVar82._0_2_;
  auVar83._0_2_ = auVar82._0_2_;
  iVar181 = (int)CONCAT11(cVar247,(char)local_3c8) >> 8;
  iVar182 = auVar83._0_4_ >> 0x18;
  auVar134._0_8_ = CONCAT44(iVar182,iVar181);
  auVar134._8_4_ = auVar143._8_4_ >> 0x18;
  auVar146._12_4_ = auVar144._12_4_ >> 0x18;
  auVar146._0_12_ = auVar134;
  fVar298 = (float)iVar182;
  cVar187 = cVar250 >> 7;
  auVar34[0xd] = 0;
  auVar34._0_13_ = auVar146._0_13_;
  auVar34[0xe] = cVar187;
  auVar39[0xc] = cVar187;
  auVar39._0_12_ = auVar134;
  auVar39._13_2_ = auVar34._13_2_;
  auVar44[0xb] = 0;
  auVar44._0_11_ = auVar134._0_11_;
  auVar44._12_3_ = auVar39._12_3_;
  auVar49[10] = cVar187;
  auVar49._0_10_ = auVar134._0_10_;
  auVar49._11_4_ = auVar44._11_4_;
  auVar54[9] = 0;
  auVar54._0_9_ = auVar134._0_9_;
  auVar54._10_5_ = auVar49._10_5_;
  auVar59[8] = cVar250;
  auVar59._0_8_ = auVar134._0_8_;
  auVar59._9_6_ = auVar54._9_6_;
  Var73 = CONCAT81(CONCAT71(auVar59._8_7_,(char)((uint)uVar25 >> 0x18)),(short)cVar247 >> 7);
  auVar64._6_9_ = Var73;
  auVar64[5] = (char)((uint)uVar25 >> 0x10);
  auVar64[4] = (undefined1)((short)cVar247 >> 7);
  auVar64._0_4_ = iVar181;
  auVar84._2_11_ = auVar64._4_11_;
  auVar84[1] = (char)((uint)uVar25 >> 8);
  auVar84[0] = (undefined1)((short)cVar247 >> 7);
  sVar127 = CONCAT11((char)uVar25,cVar247);
  auVar69._2_13_ = auVar84;
  auVar69._0_2_ = sVar127;
  uVar179 = (undefined2)Var73;
  auVar149._0_12_ = auVar69._0_12_;
  auVar149._12_2_ = uVar179;
  auVar149._14_2_ = uVar179;
  auVar148._12_4_ = auVar149._12_4_;
  auVar148._0_10_ = auVar69._0_10_;
  auVar148._10_2_ = auVar64._4_2_;
  auVar147._10_6_ = auVar148._10_6_;
  auVar147._0_8_ = auVar69._0_8_;
  auVar147._8_2_ = auVar64._4_2_;
  auVar85._4_8_ = auVar147._8_8_;
  auVar85._2_2_ = auVar84._0_2_;
  auVar85._0_2_ = auVar84._0_2_;
  fVar128 = (float)((int)sVar127 >> 8);
  fVar183 = (float)(auVar85._0_4_ >> 0x18);
  fVar188 = (float)(auVar147._8_4_ >> 0x18);
  uVar179 = CONCAT11((char)((uint)uVar20 >> 0x18),uVar291);
  uVar192 = CONCAT35(CONCAT21(uVar179,(char)((uint)uVar20 >> 0x10)),CONCAT14(uVar248,uVar24));
  uVar71 = CONCAT51(CONCAT41((int)((ulong)uVar192 >> 0x20),(char)((uint)uVar20 >> 8)),cVar250);
  sVar127 = CONCAT11((char)uVar20,cVar247);
  uVar117 = CONCAT62(uVar71,sVar127);
  auVar285._8_4_ = 0;
  auVar285._0_8_ = uVar117;
  auVar285._12_2_ = uVar179;
  auVar285._14_2_ = uVar179;
  uVar179 = (undefined2)((ulong)uVar192 >> 0x20);
  auVar284._12_4_ = auVar285._12_4_;
  auVar284._8_2_ = 0;
  auVar284._0_8_ = uVar117;
  auVar284._10_2_ = uVar179;
  auVar283._10_6_ = auVar284._10_6_;
  auVar283._8_2_ = uVar179;
  auVar283._0_8_ = uVar117;
  uVar179 = (undefined2)uVar71;
  auVar86._4_8_ = auVar283._8_8_;
  auVar86._2_2_ = uVar179;
  auVar86._0_2_ = uVar179;
  fVar343 = (float)((int)sVar127 >> 8);
  fVar348 = (float)(auVar86._0_4_ >> 0x18);
  fVar349 = (float)(auVar283._8_4_ >> 0x18);
  fVar368 = fVar329 * (float)iVar249 + fVar336 * (float)iVar222 + fVar339 * (float)iVar223;
  fVar373 = fVar329 * fVar307 + fVar336 * fVar323 + fVar339 * fVar356;
  fVar376 = fVar329 * (float)auVar132._8_4_ +
            fVar336 * (float)auVar225._8_4_ + fVar339 * (float)auVar226._8_4_;
  fVar380 = fVar329 * (float)auVar138._12_4_ +
            fVar336 * (float)auVar231._12_4_ + fVar339 * (float)auVar235._12_4_;
  fVar357 = fVar329 * (float)iVar180 + fVar336 * (float)iVar224 + fVar339 * fVar293;
  fVar362 = fVar329 * fVar259 + fVar336 * fVar319 + fVar339 * fVar297;
  fVar364 = fVar329 * (float)auVar133._8_4_ + fVar336 * (float)auVar227._8_4_ + fVar339 * fVar300;
  fVar366 = fVar329 * (float)auVar142._12_4_ +
            fVar336 * (float)auVar239._12_4_ + fVar339 * (float)(auVar241._12_4_ >> 0x18);
  fVar263 = fVar329 * (float)iVar181 + fVar336 * fVar128 + fVar339 * fVar343;
  fVar280 = fVar329 * fVar298 + fVar336 * fVar183 + fVar339 * fVar348;
  fVar281 = fVar329 * (float)auVar134._8_4_ + fVar336 * fVar188 + fVar339 * fVar349;
  fVar329 = fVar329 * (float)auVar146._12_4_ +
            fVar336 * (float)(auVar148._12_4_ >> 0x18) + fVar339 * (float)(auVar284._12_4_ >> 0x18);
  uVar192 = *(undefined8 *)(prim + uVar108 * 7 + 6);
  uVar12 = *(undefined8 *)(prim + uVar108 * 0xb + 6);
  auVar312._0_4_ = (float)iVar224 * fVar217 + fVar293 * fVar219;
  fVar320 = fVar319 * fVar217 + fVar297 * fVar219;
  auVar311._0_8_ = CONCAT44(fVar320,auVar312._0_4_);
  auVar311._8_4_ = (float)auVar227._8_4_ * fVar217 + fVar300 * fVar219;
  uVar13 = *(undefined8 *)(prim + uVar108 * 9 + 6);
  uVar14 = *(undefined8 *)(prim + uVar108 * 0xd + 6);
  uVar15 = *(undefined8 *)(prim + uVar108 * 0x12 + 6);
  fVar339 = (float)iVar249 * fVar196 + (float)iVar222 * fVar217 + (float)iVar223 * fVar219;
  fVar293 = fVar307 * fVar196 + fVar323 * fVar217 + fVar356 * fVar219;
  fVar297 = (float)auVar132._8_4_ * fVar196 +
            (float)auVar225._8_4_ * fVar217 + (float)auVar226._8_4_ * fVar219;
  fVar307 = (float)auVar138._12_4_ * fVar196 +
            (float)auVar231._12_4_ * fVar217 + (float)auVar235._12_4_ * fVar219;
  local_3c8 = (float)iVar180 * fVar196 + auVar312._0_4_;
  fStack_3c4 = fVar259 * fVar196 + fVar320;
  fStack_3c0 = (float)auVar133._8_4_ * fVar196 + auVar311._8_4_;
  fStack_3bc = (float)auVar142._12_4_ * fVar196 +
               (float)auVar239._12_4_ * fVar217 + (float)(auVar241._12_4_ >> 0x18) * fVar219;
  fVar336 = fVar196 * (float)iVar181 + fVar217 * fVar128 + fVar219 * fVar343;
  fVar343 = fVar196 * fVar298 + fVar217 * fVar183 + fVar219 * fVar348;
  fVar348 = fVar196 * (float)auVar134._8_4_ + fVar217 * fVar188 + fVar219 * fVar349;
  fVar349 = fVar196 * (float)auVar146._12_4_ +
            fVar217 * (float)(auVar148._12_4_ >> 0x18) + fVar219 * (float)(auVar284._12_4_ >> 0x18);
  fVar128 = (float)DAT_01f4bd50;
  fVar183 = DAT_01f4bd50._4_4_;
  fVar188 = DAT_01f4bd50._8_4_;
  fVar196 = DAT_01f4bd50._12_4_;
  uVar122 = -(uint)(fVar128 <= ABS(fVar368));
  uVar123 = -(uint)(fVar183 <= ABS(fVar373));
  uVar124 = -(uint)(fVar188 <= ABS(fVar376));
  uVar125 = -(uint)(fVar196 <= ABS(fVar380));
  auVar371._0_4_ = (uint)fVar368 & uVar122;
  auVar371._4_4_ = (uint)fVar373 & uVar123;
  auVar371._8_4_ = (uint)fVar376 & uVar124;
  auVar371._12_4_ = (uint)fVar380 & uVar125;
  auVar150._0_4_ = ~uVar122 & (uint)fVar128;
  auVar150._4_4_ = ~uVar123 & (uint)fVar183;
  auVar150._8_4_ = ~uVar124 & (uint)fVar188;
  auVar150._12_4_ = ~uVar125 & (uint)fVar196;
  auVar150 = auVar150 | auVar371;
  uVar122 = -(uint)(fVar128 <= ABS(fVar357));
  uVar123 = -(uint)(fVar183 <= ABS(fVar362));
  uVar124 = -(uint)(fVar188 <= ABS(fVar364));
  uVar125 = -(uint)(fVar196 <= ABS(fVar366));
  auVar359._0_4_ = (uint)fVar357 & uVar122;
  auVar359._4_4_ = (uint)fVar362 & uVar123;
  auVar359._8_4_ = (uint)fVar364 & uVar124;
  auVar359._12_4_ = (uint)fVar366 & uVar125;
  auVar303._0_4_ = ~uVar122 & (uint)fVar128;
  auVar303._4_4_ = ~uVar123 & (uint)fVar183;
  auVar303._8_4_ = ~uVar124 & (uint)fVar188;
  auVar303._12_4_ = ~uVar125 & (uint)fVar196;
  auVar303 = auVar303 | auVar359;
  uVar122 = -(uint)(fVar128 <= ABS(fVar263));
  uVar123 = -(uint)(fVar183 <= ABS(fVar280));
  uVar124 = -(uint)(fVar188 <= ABS(fVar281));
  uVar125 = -(uint)(fVar196 <= ABS(fVar329));
  auVar264._0_4_ = (uint)fVar263 & uVar122;
  auVar264._4_4_ = (uint)fVar280 & uVar123;
  auVar264._8_4_ = (uint)fVar281 & uVar124;
  auVar264._12_4_ = (uint)fVar329 & uVar125;
  auVar350._0_4_ = ~uVar122 & (uint)fVar128;
  auVar350._4_4_ = ~uVar123 & (uint)fVar183;
  auVar350._8_4_ = ~uVar124 & (uint)fVar188;
  auVar350._12_4_ = ~uVar125 & (uint)fVar196;
  auVar350 = auVar350 | auVar264;
  auVar198 = rcpps(_DAT_01f4bd50,auVar150);
  local_3f8 = auVar198._0_4_;
  auVar151._0_4_ = auVar150._0_4_ * local_3f8;
  fStack_3f4 = auVar198._4_4_;
  auVar151._4_4_ = auVar150._4_4_ * fStack_3f4;
  fStack_3f0 = auVar198._8_4_;
  auVar151._8_4_ = auVar150._8_4_ * fStack_3f0;
  fStack_3ec = auVar198._12_4_;
  auVar151._12_4_ = auVar150._12_4_ * fStack_3ec;
  auVar265._0_4_ = (float)DAT_01f46a60;
  fVar196 = DAT_01f46a60._4_4_;
  auVar268._0_12_ = DAT_01f46a60._0_12_;
  fVar217 = DAT_01f46a60._12_4_;
  fVar219 = DAT_01f46a60._8_4_;
  local_3f8 = (auVar265._0_4_ - auVar151._0_4_) * local_3f8 + local_3f8;
  fStack_3f4 = (fVar196 - auVar151._4_4_) * fStack_3f4 + fStack_3f4;
  fStack_3f0 = (fVar219 - auVar151._8_4_) * fStack_3f0 + fStack_3f0;
  fStack_3ec = (fVar217 - auVar151._12_4_) * fStack_3ec + fStack_3ec;
  auVar198 = rcpps(auVar151,auVar303);
  fVar128 = auVar198._0_4_;
  fVar183 = auVar198._4_4_;
  fVar280 = auVar198._8_4_;
  fVar319 = auVar198._12_4_;
  fVar128 = (auVar265._0_4_ - auVar303._0_4_ * fVar128) * fVar128 + fVar128;
  fVar183 = (fVar196 - auVar303._4_4_ * fVar183) * fVar183 + fVar183;
  fVar280 = (fVar219 - auVar303._8_4_ * fVar280) * fVar280 + fVar280;
  fVar319 = (fVar217 - auVar303._12_4_ * fVar319) * fVar319 + fVar319;
  auVar198 = rcpps(auVar198,auVar350);
  auVar152._0_4_ = auVar198._0_4_;
  fVar188 = auVar198._4_4_;
  fVar281 = auVar198._8_4_;
  fVar323 = auVar198._12_4_;
  uVar117 = *(ulong *)(prim + uVar108 * 0x16 + 6);
  fVar356 = (auVar265._0_4_ - auVar350._0_4_ * auVar152._0_4_) * auVar152._0_4_ + auVar152._0_4_;
  fVar188 = (fVar196 - auVar350._4_4_ * fVar188) * fVar188 + fVar188;
  fVar281 = (fVar219 - auVar350._8_4_ * fVar281) * fVar281 + fVar281;
  fVar323 = (fVar217 - auVar350._12_4_ * fVar323) * fVar323 + fVar323;
  local_448._0_2_ = (short)uVar192;
  local_448._2_2_ = (undefined2)((ulong)uVar192 >> 0x10);
  uStack_444 = (undefined2)((ulong)uVar192 >> 0x20);
  uStack_442 = (undefined2)((ulong)uVar192 >> 0x30);
  auVar155._0_12_ = auVar198._0_12_;
  auVar155._12_2_ = auVar198._6_2_;
  auVar155._14_2_ = uStack_442;
  auVar154._12_4_ = auVar155._12_4_;
  auVar154._0_10_ = auVar198._0_10_;
  auVar154._10_2_ = uStack_444;
  auVar153._10_6_ = auVar154._10_6_;
  auVar153._0_8_ = auVar198._0_8_;
  auVar153._8_2_ = auVar198._4_2_;
  auVar152._8_8_ = auVar153._8_8_;
  auVar152._6_2_ = local_448._2_2_;
  auVar152._4_2_ = auVar198._2_2_;
  auVar156._0_4_ = (float)(int)(short)local_448;
  fVar196 = (float)(auVar152._4_4_ >> 0x10);
  auVar135._0_8_ = CONCAT44(fVar196,auVar156._0_4_);
  auVar135._8_4_ = (float)(auVar153._8_4_ >> 0x10);
  local_468 = (short)uVar12;
  uStack_466 = (undefined2)((ulong)uVar12 >> 0x10);
  uStack_464 = (undefined2)((ulong)uVar12 >> 0x20);
  uStack_462 = (undefined2)((ulong)uVar12 >> 0x30);
  auVar268._12_2_ = DAT_01f46a60._6_2_;
  auVar268._14_2_ = uStack_462;
  auVar267._12_4_ = auVar268._12_4_;
  auVar267._0_10_ = (unkbyte10)DAT_01f46a60;
  auVar267._10_2_ = uStack_464;
  auVar266._10_6_ = auVar267._10_6_;
  auVar266._0_8_ = (undefined8)DAT_01f46a60;
  auVar266._8_2_ = DAT_01f46a60._4_2_;
  auVar265._8_8_ = auVar266._8_8_;
  auVar265._6_2_ = uStack_466;
  auVar265._4_2_ = DAT_01f46a60._2_2_;
  auVar159._12_2_ = (short)((uint)fVar196 >> 0x10);
  auVar159._0_12_ = auVar135;
  auVar159._14_2_ = (short)((ulong)uVar13 >> 0x30);
  auVar158._12_4_ = auVar159._12_4_;
  auVar158._0_10_ = auVar135._0_10_;
  auVar158._10_2_ = (short)((ulong)uVar13 >> 0x20);
  auVar157._10_6_ = auVar158._10_6_;
  auVar157._8_2_ = SUB42(fVar196,0);
  auVar157._0_8_ = auVar135._0_8_;
  auVar156._8_8_ = auVar157._8_8_;
  auVar156._6_2_ = (short)((ulong)uVar13 >> 0x10);
  auVar156._4_2_ = (short)((uint)auVar156._0_4_ >> 0x10);
  auVar160._0_4_ = (float)(int)(short)uVar13;
  fVar217 = (float)(auVar156._4_4_ >> 0x10);
  auVar136._0_8_ = CONCAT44(fVar217,auVar160._0_4_);
  auVar136._8_4_ = (float)(auVar157._8_4_ >> 0x10);
  auVar315._12_2_ = (short)((uint)fVar320 >> 0x10);
  auVar315._0_12_ = auVar311;
  auVar315._14_2_ = (short)((ulong)uVar14 >> 0x30);
  auVar314._12_4_ = auVar315._12_4_;
  auVar314._0_10_ = auVar311._0_10_;
  auVar314._10_2_ = (short)((ulong)uVar14 >> 0x20);
  auVar313._10_6_ = auVar314._10_6_;
  auVar313._8_2_ = SUB42(fVar320,0);
  auVar313._0_8_ = auVar311._0_8_;
  auVar312._8_8_ = auVar313._8_8_;
  auVar312._6_2_ = (short)((ulong)uVar14 >> 0x10);
  auVar312._4_2_ = (short)((uint)auVar312._0_4_ >> 0x10);
  local_458 = (short)uVar15;
  uStack_456 = (undefined2)((ulong)uVar15 >> 0x10);
  uStack_454 = (undefined2)((ulong)uVar15 >> 0x20);
  uStack_452 = (undefined2)((ulong)uVar15 >> 0x30);
  auVar163._12_2_ = (short)((uint)fVar217 >> 0x10);
  auVar163._0_12_ = auVar136;
  auVar163._14_2_ = uStack_452;
  auVar162._12_4_ = auVar163._12_4_;
  auVar162._0_10_ = auVar136._0_10_;
  auVar162._10_2_ = uStack_454;
  auVar161._10_6_ = auVar162._10_6_;
  auVar161._8_2_ = SUB42(fVar217,0);
  auVar161._0_8_ = auVar136._0_8_;
  auVar160._8_8_ = auVar161._8_8_;
  auVar160._6_2_ = uStack_456;
  auVar160._4_2_ = (short)((uint)auVar160._0_4_ >> 0x10);
  fVar219 = (float)(auVar160._4_4_ >> 0x10);
  fVar329 = (float)(auVar161._8_4_ >> 0x10);
  uVar179 = (undefined2)(uVar117 >> 0x30);
  auVar201._8_4_ = 0;
  auVar201._0_8_ = uVar117;
  auVar201._12_2_ = uVar179;
  auVar201._14_2_ = uVar179;
  uVar179 = (undefined2)(uVar117 >> 0x20);
  auVar200._12_4_ = auVar201._12_4_;
  auVar200._8_2_ = 0;
  auVar200._0_8_ = uVar117;
  auVar200._10_2_ = uVar179;
  auVar199._10_6_ = auVar200._10_6_;
  auVar199._8_2_ = uVar179;
  auVar199._0_8_ = uVar117;
  uVar179 = (undefined2)(uVar117 >> 0x10);
  auVar87._4_8_ = auVar199._8_8_;
  auVar87._2_2_ = uVar179;
  auVar87._0_2_ = uVar179;
  uVar112 = *(ulong *)(prim + uVar108 * 0x14 + 6);
  uVar179 = (undefined2)(uVar112 >> 0x30);
  auVar166._8_4_ = 0;
  auVar166._0_8_ = uVar112;
  auVar166._12_2_ = uVar179;
  auVar166._14_2_ = uVar179;
  uVar179 = (undefined2)(uVar112 >> 0x20);
  auVar165._12_4_ = auVar166._12_4_;
  auVar165._8_2_ = 0;
  auVar165._0_8_ = uVar112;
  auVar165._10_2_ = uVar179;
  auVar164._10_6_ = auVar165._10_6_;
  auVar164._8_2_ = uVar179;
  auVar164._0_8_ = uVar112;
  uVar179 = (undefined2)(uVar112 >> 0x10);
  auVar88._4_8_ = auVar164._8_8_;
  auVar88._2_2_ = uVar179;
  auVar88._0_2_ = uVar179;
  fVar259 = (float)(auVar88._0_4_ >> 0x10);
  fVar298 = (float)(auVar164._8_4_ >> 0x10);
  uVar110 = *(ulong *)(prim + uVar108 * 0x18 + 6);
  uVar179 = (undefined2)(uVar110 >> 0x30);
  auVar204._8_4_ = 0;
  auVar204._0_8_ = uVar110;
  auVar204._12_2_ = uVar179;
  auVar204._14_2_ = uVar179;
  uVar179 = (undefined2)(uVar110 >> 0x20);
  auVar203._12_4_ = auVar204._12_4_;
  auVar203._8_2_ = 0;
  auVar203._0_8_ = uVar110;
  auVar203._10_2_ = uVar179;
  auVar202._10_6_ = auVar203._10_6_;
  auVar202._8_2_ = uVar179;
  auVar202._0_8_ = uVar110;
  uVar179 = (undefined2)(uVar110 >> 0x10);
  auVar89._4_8_ = auVar202._8_8_;
  auVar89._2_2_ = uVar179;
  auVar89._0_2_ = uVar179;
  uVar16 = *(ulong *)(prim + uVar108 * 0x1d + 6);
  uVar179 = (undefined2)(uVar16 >> 0x30);
  auVar169._8_4_ = 0;
  auVar169._0_8_ = uVar16;
  auVar169._12_2_ = uVar179;
  auVar169._14_2_ = uVar179;
  uVar179 = (undefined2)(uVar16 >> 0x20);
  auVar168._12_4_ = auVar169._12_4_;
  auVar168._8_2_ = 0;
  auVar168._0_8_ = uVar16;
  auVar168._10_2_ = uVar179;
  auVar167._10_6_ = auVar168._10_6_;
  auVar167._8_2_ = uVar179;
  auVar167._0_8_ = uVar16;
  uVar179 = (undefined2)(uVar16 >> 0x10);
  auVar90._4_8_ = auVar167._8_8_;
  auVar90._2_2_ = uVar179;
  auVar90._0_2_ = uVar179;
  fVar263 = (float)(auVar90._0_4_ >> 0x10);
  fVar300 = (float)(auVar167._8_4_ >> 0x10);
  uVar17 = *(ulong *)(prim + uVar108 * 0x21 + 6);
  uVar179 = (undefined2)(uVar17 >> 0x30);
  auVar207._8_4_ = 0;
  auVar207._0_8_ = uVar17;
  auVar207._12_2_ = uVar179;
  auVar207._14_2_ = uVar179;
  uVar179 = (undefined2)(uVar17 >> 0x20);
  auVar206._12_4_ = auVar207._12_4_;
  auVar206._8_2_ = 0;
  auVar206._0_8_ = uVar17;
  auVar206._10_2_ = uVar179;
  auVar205._10_6_ = auVar206._10_6_;
  auVar205._8_2_ = uVar179;
  auVar205._0_8_ = uVar17;
  uVar179 = (undefined2)(uVar17 >> 0x10);
  auVar91._4_8_ = auVar205._8_8_;
  auVar91._2_2_ = uVar179;
  auVar91._0_2_ = uVar179;
  uVar18 = *(ulong *)(prim + uVar108 * 0x1f + 6);
  uVar179 = (undefined2)(uVar18 >> 0x30);
  auVar172._8_4_ = 0;
  auVar172._0_8_ = uVar18;
  auVar172._12_2_ = uVar179;
  auVar172._14_2_ = uVar179;
  uVar179 = (undefined2)(uVar18 >> 0x20);
  auVar171._12_4_ = auVar172._12_4_;
  auVar171._8_2_ = 0;
  auVar171._0_8_ = uVar18;
  auVar171._10_2_ = uVar179;
  auVar170._10_6_ = auVar171._10_6_;
  auVar170._8_2_ = uVar179;
  auVar170._0_8_ = uVar18;
  uVar179 = (undefined2)(uVar18 >> 0x10);
  auVar92._4_8_ = auVar170._8_8_;
  auVar92._2_2_ = uVar179;
  auVar92._0_2_ = uVar179;
  fVar320 = (float)(auVar92._0_4_ >> 0x10);
  fVar357 = (float)(auVar170._8_4_ >> 0x10);
  uVar108 = *(ulong *)(prim + uVar108 * 0x23 + 6);
  uVar179 = (undefined2)(uVar108 >> 0x30);
  auVar175._8_4_ = 0;
  auVar175._0_8_ = uVar108;
  auVar175._12_2_ = uVar179;
  auVar175._14_2_ = uVar179;
  uVar179 = (undefined2)(uVar108 >> 0x20);
  auVar174._12_4_ = auVar175._12_4_;
  auVar174._8_2_ = 0;
  auVar174._0_8_ = uVar108;
  auVar174._10_2_ = uVar179;
  auVar173._10_6_ = auVar174._10_6_;
  auVar173._8_2_ = uVar179;
  auVar173._0_8_ = uVar108;
  uVar179 = (undefined2)(uVar108 >> 0x10);
  auVar93._4_8_ = auVar173._8_8_;
  auVar93._2_2_ = uVar179;
  auVar93._0_2_ = uVar179;
  auVar269._0_8_ =
       CONCAT44(((((float)(auVar265._4_4_ >> 0x10) - fVar196) * local_3e8 + fVar196) - fVar293) *
                fStack_3f4,
                ((((float)(int)local_468 - auVar156._0_4_) * local_3e8 + auVar156._0_4_) - fVar339)
                * local_3f8);
  auVar269._8_4_ =
       ((((float)(auVar266._8_4_ >> 0x10) - auVar135._8_4_) * local_3e8 + auVar135._8_4_) - fVar297)
       * fStack_3f0;
  auVar269._12_4_ =
       ((((float)(auVar267._12_4_ >> 0x10) - (float)(auVar154._12_4_ >> 0x10)) * local_3e8 +
        (float)(auVar154._12_4_ >> 0x10)) - fVar307) * fStack_3ec;
  local_408._0_4_ =
       ((((float)(int)(short)uVar14 - auVar160._0_4_) * local_3e8 + auVar160._0_4_) - fVar339) *
       local_3f8;
  local_408._4_4_ =
       ((((float)(auVar312._4_4_ >> 0x10) - fVar217) * local_3e8 + fVar217) - fVar293) * fStack_3f4;
  local_408._8_4_ =
       ((((float)(auVar313._8_4_ >> 0x10) - auVar136._8_4_) * local_3e8 + auVar136._8_4_) - fVar297)
       * fStack_3f0;
  local_408._12_4_ =
       ((((float)(auVar314._12_4_ >> 0x10) - (float)(auVar158._12_4_ >> 0x10)) * local_3e8 +
        (float)(auVar158._12_4_ >> 0x10)) - fVar307) * fStack_3ec;
  auVar321._0_8_ =
       CONCAT44(((((float)(auVar87._0_4_ >> 0x10) - fVar219) * local_3e8 + fVar219) - fStack_3c4) *
                fVar183,((((float)(int)(short)uVar117 - (float)(int)local_458) * local_3e8 +
                         (float)(int)local_458) - local_3c8) * fVar128);
  auVar321._8_4_ =
       ((((float)(auVar199._8_4_ >> 0x10) - fVar329) * local_3e8 + fVar329) - fStack_3c0) * fVar280;
  auVar321._12_4_ =
       ((((float)(auVar200._12_4_ >> 0x10) - (float)(auVar162._12_4_ >> 0x10)) * local_3e8 +
        (float)(auVar162._12_4_ >> 0x10)) - fStack_3bc) * fVar319;
  auVar325._0_4_ =
       ((((float)(int)(short)uVar110 - (float)(int)(short)uVar112) * local_3e8 +
        (float)(int)(short)uVar112) - local_3c8) * fVar128;
  auVar325._4_4_ =
       ((((float)(auVar89._0_4_ >> 0x10) - fVar259) * local_3e8 + fVar259) - fStack_3c4) * fVar183;
  auVar325._8_4_ =
       ((((float)(auVar202._8_4_ >> 0x10) - fVar298) * local_3e8 + fVar298) - fStack_3c0) * fVar280;
  auVar325._12_4_ =
       ((((float)(auVar203._12_4_ >> 0x10) - (float)(auVar165._12_4_ >> 0x10)) * local_3e8 +
        (float)(auVar165._12_4_ >> 0x10)) - fStack_3bc) * fVar319;
  auVar333._0_8_ =
       CONCAT44(((((float)(auVar91._0_4_ >> 0x10) - fVar263) * local_3e8 + fVar263) - fVar343) *
                fVar188,((((float)(int)(short)uVar17 - (float)(int)(short)uVar16) * local_3e8 +
                         (float)(int)(short)uVar16) - fVar336) * fVar356);
  auVar333._8_4_ =
       ((((float)(auVar205._8_4_ >> 0x10) - fVar300) * local_3e8 + fVar300) - fVar348) * fVar281;
  auVar333._12_4_ =
       ((((float)(auVar206._12_4_ >> 0x10) - (float)(auVar168._12_4_ >> 0x10)) * local_3e8 +
        (float)(auVar168._12_4_ >> 0x10)) - fVar349) * fVar323;
  auVar344._0_4_ =
       ((((float)(int)(short)uVar108 - (float)(int)(short)uVar18) * local_3e8 +
        (float)(int)(short)uVar18) - fVar336) * fVar356;
  auVar344._4_4_ =
       ((((float)(auVar93._0_4_ >> 0x10) - fVar320) * local_3e8 + fVar320) - fVar343) * fVar188;
  auVar344._8_4_ =
       ((((float)(auVar173._8_4_ >> 0x10) - fVar357) * local_3e8 + fVar357) - fVar348) * fVar281;
  auVar344._12_4_ =
       ((((float)(auVar174._12_4_ >> 0x10) - (float)(auVar171._12_4_ >> 0x10)) * local_3e8 +
        (float)(auVar171._12_4_ >> 0x10)) - fVar349) * fVar323;
  auVar252._8_4_ = auVar269._8_4_;
  auVar252._0_8_ = auVar269._0_8_;
  auVar252._12_4_ = auVar269._12_4_;
  auVar253 = minps(auVar252,(undefined1  [16])local_408);
  auVar208._8_4_ = auVar321._8_4_;
  auVar208._0_8_ = auVar321._0_8_;
  auVar208._12_4_ = auVar321._12_4_;
  auVar198 = minps(auVar208,auVar325);
  auVar253 = maxps(auVar253,auVar198);
  auVar209._8_4_ = auVar333._8_4_;
  auVar209._0_8_ = auVar333._0_8_;
  auVar209._12_4_ = auVar333._12_4_;
  auVar198 = minps(auVar209,auVar344);
  uVar116 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar243._4_4_ = uVar116;
  auVar243._0_4_ = uVar116;
  auVar243._8_4_ = uVar116;
  auVar243._12_4_ = uVar116;
  auVar198 = maxps(auVar198,auVar243);
  auVar198 = maxps(auVar253,auVar198);
  fVar128 = auVar198._0_4_ * 0.99999964;
  fVar183 = auVar198._4_4_ * 0.99999964;
  fVar293 = auVar198._8_4_ * 0.99999964;
  fVar188 = auVar198._12_4_ * 0.99999964;
  auVar198 = maxps(auVar269,(undefined1  [16])local_408);
  auVar253 = maxps(auVar321,auVar325);
  auVar198 = minps(auVar198,auVar253);
  auVar253 = maxps(auVar333,auVar344);
  fVar339 = ray->tfar;
  auVar210._4_4_ = fVar339;
  auVar210._0_4_ = fVar339;
  auVar210._8_4_ = fVar339;
  auVar210._12_4_ = fVar339;
  auVar253 = minps(auVar253,auVar210);
  auVar198 = minps(auVar198,auVar253);
  auVar211._0_4_ = -(uint)(PVar19 != (Primitive)0x0 && fVar128 <= auVar198._0_4_ * 1.0000004);
  auVar211._4_4_ = -(uint)(1 < (byte)PVar19 && fVar183 <= auVar198._4_4_ * 1.0000004);
  auVar211._8_4_ = -(uint)(2 < (byte)PVar19 && fVar293 <= auVar198._8_4_ * 1.0000004);
  auVar211._12_4_ = -(uint)(3 < (byte)PVar19 && fVar188 <= auVar198._12_4_ * 1.0000004);
  uVar116 = movmskps((int)unaff_RBP,auVar211);
  local_328 = mm_lookupmask_ps._0_8_;
  uStack_320 = mm_lookupmask_ps._8_8_;
  local_3d8 = fVar128;
  fStack_3d4 = fVar183;
  fStack_3d0 = fVar293;
  fStack_3cc = fVar188;
  fStack_3e4 = local_3e8;
  fStack_3e0 = local_3e8;
  fStack_3dc = local_3e8;
  local_3b0 = context;
  local_330 = pre;
  local_170 = prim;
  for (uVar117 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar116); pRVar107 = local_3b0,
      uVar117 != 0; uVar117 = (ulong)((uint)uVar117 & (uint)uVar117 + 0xf & uVar122)) {
    lVar119 = 0;
    if (uVar117 != 0) {
      for (; (uVar117 >> lVar119 & 1) == 0; lVar119 = lVar119 + 1) {
      }
    }
    local_350 = (RTCIntersectArguments *)(ulong)*(uint *)(local_170 + 2);
    local_270 = (RayQueryContext *)(ulong)*(uint *)(local_170 + lVar119 * 4 + 6);
    pGVar26 = (local_3b0->scene->geometries).items[(long)local_350].ptr;
    uVar112 = (ulong)*(uint *)(*(long *)&pGVar26->field_0x58 +
                              (long)local_270 *
                              pGVar26[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar339 = (pGVar26->time_range).lower;
    fVar196 = (((ray->dir).field_0.m128[3] - fVar339) / ((pGVar26->time_range).upper - fVar339)) *
              pGVar26->fnumTimeSegments;
    local_3c8 = pGVar26->fnumTimeSegments;
    fVar339 = floorf(fVar196);
    if (local_3c8 + -1.0 <= fVar339) {
      fVar339 = local_3c8 + -1.0;
    }
    fVar217 = 0.0;
    if (0.0 <= fVar339) {
      fVar217 = fVar339;
    }
    _Var27 = pGVar26[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar109 = (long)(int)fVar217 * 0x38;
    lVar115 = *(long *)(_Var27 + 0x10 + lVar109);
    lVar120 = *(long *)(_Var27 + 0x38 + lVar109);
    lVar28 = *(long *)(_Var27 + 0x48 + lVar109);
    pfVar1 = (float *)(lVar120 + lVar28 * uVar112);
    lVar119 = uVar112 + 1;
    pfVar2 = (float *)(lVar120 + lVar28 * lVar119);
    p_Var29 = pGVar26[4].occlusionFilterN;
    pfVar3 = (float *)(*(long *)(_Var27 + lVar109) + lVar115 * uVar112);
    pfVar4 = (float *)(*(long *)(_Var27 + lVar109) + lVar115 * lVar119);
    pRVar114 = *(RayQueryContext **)(p_Var29 + lVar109 + 0x38);
    pRVar111 = (RTCIntersectArguments *)(*(long *)(p_Var29 + lVar109 + 0x10) * lVar119);
    ppSVar5 = (Scene **)((long)&pRVar114->scene + uVar112 * *(long *)(p_Var29 + lVar109 + 0x48));
    pfVar6 = (float *)(*(long *)(p_Var29 + lVar109) + *(long *)(p_Var29 + lVar109 + 0x10) * uVar112)
    ;
    fVar196 = fVar196 - fVar217;
    fVar339 = 1.0 - fVar196;
    fVar336 = *pfVar3 * fVar339 + *pfVar1 * fVar196;
    fVar343 = pfVar3[1] * fVar339 + pfVar1[1] * fVar196;
    fVar348 = pfVar3[2] * fVar339 + pfVar1[2] * fVar196;
    fVar356 = pfVar3[3] * fVar339 + pfVar1[3] * fVar196;
    ppSVar7 = (Scene **)((long)&pRVar114->scene + *(long *)(p_Var29 + lVar109 + 0x48) * lVar119);
    pfVar1 = (float *)((long)&pRVar111->flags + *(long *)(p_Var29 + lVar109));
    local_238 = *pfVar4 * fVar339 + *pfVar2 * fVar196;
    fStack_234 = pfVar4[1] * fVar339 + pfVar2[1] * fVar196;
    fStack_230 = pfVar4[2] * fVar339 + pfVar2[2] * fVar196;
    fStack_22c = pfVar4[3] * fVar339 + pfVar2[3] * fVar196;
    local_248 = (*pfVar6 * fVar339 + *(float *)ppSVar5 * fVar196) * 0.33333334 + fVar336;
    fStack_244 = (pfVar6[1] * fVar339 + *(float *)((long)ppSVar5 + 4) * fVar196) * 0.33333334 +
                 fVar343;
    fStack_240 = (pfVar6[2] * fVar339 + *(float *)(ppSVar5 + 1) * fVar196) * 0.33333334 + fVar348;
    fStack_23c = (pfVar6[3] * fVar339 + *(float *)((long)ppSVar5 + 0xc) * fVar196) * 0.33333334 +
                 fVar356;
    local_258 = local_238 - (fVar339 * *pfVar1 + fVar196 * *(float *)ppSVar7) * 0.33333334;
    fStack_254 = fStack_234 -
                 (fVar339 * pfVar1[1] + fVar196 * *(float *)((long)ppSVar7 + 4)) * 0.33333334;
    fStack_250 = fStack_230 - (fVar339 * pfVar1[2] + fVar196 * *(float *)(ppSVar7 + 1)) * 0.33333334
    ;
    fVar362 = fStack_22c -
              (fVar339 * pfVar1[3] + fVar196 * *(float *)((long)ppSVar7 + 0xc)) * 0.33333334;
    fVar339 = (ray->org).field_0.m128[0];
    fVar196 = (ray->org).field_0.m128[1];
    fVar217 = (ray->org).field_0.m128[2];
    local_1f8 = (ray->org).field_0.m128[3];
    fVar307 = fVar336 - fVar339;
    fVar319 = fVar343 - fVar196;
    fVar323 = fVar348 - fVar217;
    fVar219 = (local_330->ray_space).vx.field_0.m128[0];
    fVar259 = (local_330->ray_space).vx.field_0.m128[1];
    fVar263 = (local_330->ray_space).vx.field_0.m128[2];
    fVar297 = (local_330->ray_space).vy.field_0.m128[0];
    fVar280 = (local_330->ray_space).vy.field_0.m128[1];
    fVar281 = (local_330->ray_space).vy.field_0.m128[2];
    fVar329 = (local_330->ray_space).vz.field_0.m128[0];
    fVar298 = (local_330->ray_space).vz.field_0.m128[1];
    fVar300 = (local_330->ray_space).vz.field_0.m128[2];
    local_188 = fVar307 * fVar219 + fVar319 * fVar297 + fVar323 * fVar329;
    local_198 = fVar307 * fVar259 + fVar319 * fVar280 + fVar323 * fVar298;
    fVar320 = fVar307 * fVar263 + fVar319 * fVar281 + fVar323 * fVar300;
    fVar307 = local_248 - fVar339;
    fVar319 = fStack_244 - fVar196;
    fVar323 = fStack_240 - fVar217;
    local_218 = fVar307 * fVar219 + fVar319 * fVar297 + fVar323 * fVar329;
    local_318 = fVar307 * fVar259 + fVar319 * fVar280 + fVar323 * fVar298;
    fStack_3c4 = fVar307 * fVar263 + fVar319 * fVar281 + fVar323 * fVar300;
    fVar319 = local_258 - fVar339;
    fVar323 = fStack_254 - fVar196;
    fVar349 = fStack_250 - fVar217;
    fVar357 = fVar319 * fVar219 + fVar323 * fVar297 + fVar349 * fVar329;
    local_208 = fVar319 * fVar259 + fVar323 * fVar280 + fVar349 * fVar298;
    fVar307 = fVar319 * fVar263 + fVar323 * fVar281 + fVar349 * fVar300;
    fVar339 = local_238 - fVar339;
    fVar196 = fStack_234 - fVar196;
    fVar217 = fStack_230 - fVar217;
    iVar249 = (int)pGVar26[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    fVar219 = fVar339 * fVar219 + fVar196 * fVar297 + fVar217 * fVar329;
    fVar259 = fVar339 * fVar259 + fVar196 * fVar280 + fVar217 * fVar298;
    fVar196 = fVar339 * fVar263 + fVar196 * fVar281 + fVar217 * fVar300;
    auVar304._0_8_ = CONCAT44(local_198,local_188) & 0x7fffffff7fffffff;
    auVar304._8_4_ = ABS(fVar320);
    auVar304._12_4_ = ABS(fVar356);
    auVar254._0_8_ = CONCAT44(local_318,local_218) & 0x7fffffff7fffffff;
    auVar254._8_4_ = ABS(fStack_3c4);
    auVar254._12_4_ = ABS(fStack_23c);
    auVar253 = maxps(auVar304,auVar254);
    auVar270._0_8_ = CONCAT44(local_208,fVar357) & 0x7fffffff7fffffff;
    auVar270._8_4_ = ABS(fVar307);
    auVar270._12_4_ = ABS(fVar362);
    auVar212._0_8_ = CONCAT44(fVar259,fVar219) & 0x7fffffff7fffffff;
    auVar212._8_4_ = ABS(fVar196);
    auVar212._12_4_ = ABS(fStack_22c);
    auVar198 = maxps(auVar270,auVar212);
    auVar198 = maxps(auVar253,auVar198);
    local_268._4_4_ = auVar198._4_4_;
    uVar192 = auVar198._8_8_;
    fVar339 = (float)local_268._4_4_;
    if ((float)local_268._4_4_ <= auVar198._0_4_) {
      fVar339 = auVar198._0_4_;
    }
    auVar305._8_8_ = uVar192;
    auVar305._0_8_ = uVar192;
    if (auVar198._8_4_ <= fVar339) {
      auVar306._4_12_ = auVar305._4_12_;
      auVar306._0_4_ = fVar339;
      uVar192 = auVar306._0_8_;
    }
    local_268._0_4_ = (undefined4)iVar249;
    fStack_260 = (float)local_268._4_4_;
    fStack_25c = (float)local_268._4_4_;
    local_378._4_4_ = -(uint)(1.0 < (float)local_268._0_4_);
    local_378._0_4_ = -(uint)(0.0 < (float)local_268._0_4_);
    fStack_370 = (float)-(uint)(2.0 < (float)local_268._0_4_);
    fStack_36c = (float)-(uint)(3.0 < (float)local_268._0_4_);
    lVar119 = (long)iVar249;
    lVar115 = lVar119 * 0x44;
    local_398._4_4_ = local_208;
    local_398._0_4_ = fVar357;
    fStack_390 = fVar307;
    fStack_38c = fVar319 * (local_330->ray_space).vx.field_0.m128[3] +
                 fVar323 * (local_330->ray_space).vy.field_0.m128[3] +
                 fVar349 * (local_330->ray_space).vz.field_0.m128[3];
    pauVar10 = (undefined1 (*) [16])(bezier_basis0 + lVar115 + 0xd8c);
    fVar339 = *(float *)*pauVar10;
    fVar217 = *(float *)(bezier_basis0 + lVar115 + 0xd90);
    fVar263 = *(float *)(bezier_basis0 + lVar115 + 0xd94);
    auVar72 = *(undefined1 (*) [12])*pauVar10;
    fVar297 = *(float *)(bezier_basis0 + lVar115 + 0xd98);
    _local_3a8 = *pauVar10;
    fVar280 = *(float *)*(undefined1 (*) [12])(bezier_basis0 + lVar115 + 0x908);
    fVar281 = *(float *)(bezier_basis0 + lVar115 + 0x90c);
    fVar329 = *(float *)(bezier_basis0 + lVar115 + 0x910);
    auVar75 = *(undefined1 (*) [12])(bezier_basis0 + lVar115 + 0x908);
    fVar298 = *(float *)(bezier_basis0 + lVar115 + 0x914);
    local_368 = *(float *)(bezier_basis0 + lVar115 + 0x484);
    fStack_364 = *(float *)(bezier_basis0 + lVar115 + 0x488);
    fStack_360 = *(float *)(bezier_basis0 + lVar115 + 0x48c);
    fStack_35c = *(float *)(bezier_basis0 + lVar115 + 0x490);
    local_1b8 = *(float *)(bezier_basis0 + lVar115);
    fStack_1b4 = *(float *)(bezier_basis0 + lVar115 + 4);
    fStack_1b0 = *(float *)(bezier_basis0 + lVar115 + 8);
    fStack_1ac = *(float *)(bezier_basis0 + lVar115 + 0xc);
    local_1a8 = local_188 * local_1b8 +
                local_218 * local_368 + fVar357 * fVar280 + fVar219 * fVar339;
    fStack_1a4 = local_188 * fStack_1b4 +
                 local_218 * fStack_364 + fVar357 * fVar281 + fVar219 * fVar217;
    fStack_1a0 = local_188 * fStack_1b0 +
                 local_218 * fStack_360 + fVar357 * fVar329 + fVar219 * fVar263;
    fStack_19c = local_188 * fStack_1ac +
                 local_218 * fStack_35c + fVar357 * fVar298 + fVar219 * fVar297;
    local_348 = local_198 * local_1b8 +
                local_318 * local_368 + local_208 * fVar280 + fVar259 * fVar339;
    fStack_344 = local_198 * fStack_1b4 +
                 local_318 * fStack_364 + local_208 * fVar281 + fVar259 * fVar217;
    fStack_340 = local_198 * fStack_1b0 +
                 local_318 * fStack_360 + local_208 * fVar329 + fVar259 * fVar263;
    fStack_33c = local_198 * fStack_1ac +
                 local_318 * fStack_35c + local_208 * fVar298 + fVar259 * fVar297;
    fVar282 = fVar356 * local_1b8 +
              fStack_23c * local_368 + fVar362 * fVar280 + fStack_22c * fVar339;
    fVar292 = fVar356 * fStack_1b4 +
              fStack_23c * fStack_364 + fVar362 * fVar281 + fStack_22c * fVar217;
    auVar286._0_8_ = CONCAT44(fVar292,fVar282);
    auVar286._8_4_ =
         fVar356 * fStack_1b0 + fStack_23c * fStack_360 + fVar362 * fVar329 + fStack_22c * fVar263;
    auVar286._12_4_ =
         fVar356 * fStack_1ac + fStack_23c * fStack_35c + fVar362 * fVar298 + fStack_22c * fVar297;
    fVar339 = *(float *)(bezier_basis1 + lVar115 + 0xd8c);
    fVar217 = *(float *)(bezier_basis1 + lVar115 + 0xd90);
    fVar263 = *(float *)(bezier_basis1 + lVar115 + 0xd94);
    fVar280 = *(float *)(bezier_basis1 + lVar115 + 0xd98);
    fVar281 = *(float *)(bezier_basis1 + lVar115 + 0x908);
    fVar329 = *(float *)(bezier_basis1 + lVar115 + 0x90c);
    fVar300 = *(float *)(bezier_basis1 + lVar115 + 0x910);
    fVar319 = *(float *)(bezier_basis1 + lVar115 + 0x914);
    fVar323 = *(float *)(bezier_basis1 + lVar115 + 0x484);
    fVar349 = *(float *)(bezier_basis1 + lVar115 + 0x488);
    fVar364 = *(float *)(bezier_basis1 + lVar115 + 0x48c);
    fVar366 = *(float *)(bezier_basis1 + lVar115 + 0x490);
    fVar368 = *(float *)(bezier_basis1 + lVar115);
    fVar373 = *(float *)(bezier_basis1 + lVar115 + 4);
    fVar376 = *(float *)(bezier_basis1 + lVar115 + 8);
    fVar380 = *(float *)(bezier_basis1 + lVar115 + 0xc);
    local_228._0_4_ =
         local_188 * fVar368 + local_218 * fVar323 + fVar357 * fVar281 + fVar219 * fVar339;
    local_228._4_4_ =
         local_188 * fVar373 + local_218 * fVar349 + fVar357 * fVar329 + fVar219 * fVar217;
    fStack_220 = local_188 * fVar376 + local_218 * fVar364 + fVar357 * fVar300 + fVar219 * fVar263;
    fStack_21c = local_188 * fVar380 + local_218 * fVar366 + fVar357 * fVar319 + fVar219 * fVar280;
    fVar129 = local_198 * fVar368 + local_318 * fVar323 + local_208 * fVar281 + fVar259 * fVar339;
    fVar184 = local_198 * fVar373 + local_318 * fVar349 + local_208 * fVar329 + fVar259 * fVar217;
    fVar189 = local_198 * fVar376 + local_318 * fVar364 + local_208 * fVar300 + fVar259 * fVar263;
    fVar193 = local_198 * fVar380 + local_318 * fVar366 + local_208 * fVar319 + fVar259 * fVar280;
    auVar334._0_4_ =
         fVar356 * fVar368 + fStack_23c * fVar323 + fVar362 * fVar281 + fStack_22c * fVar339;
    auVar334._4_4_ =
         fVar356 * fVar373 + fStack_23c * fVar349 + fVar362 * fVar329 + fStack_22c * fVar217;
    auVar334._8_4_ =
         fVar356 * fVar376 + fStack_23c * fVar364 + fVar362 * fVar300 + fStack_22c * fVar263;
    auVar334._12_4_ =
         fVar356 * fVar380 + fStack_23c * fVar366 + fVar362 * fVar319 + fStack_22c * fVar280;
    fVar294 = (float)local_228._0_4_ - local_1a8;
    fVar299 = (float)local_228._4_4_ - fStack_1a4;
    fVar301 = fStack_220 - fStack_1a0;
    fVar302 = fStack_21c - fStack_19c;
    fVar130 = fVar129 - local_348;
    fVar185 = fVar184 - fStack_344;
    fVar190 = fVar189 - fStack_340;
    fVar194 = fVar193 - fStack_33c;
    fVar369 = local_348 * fVar294 - local_1a8 * fVar130;
    fVar374 = fStack_344 * fVar299 - fStack_1a4 * fVar185;
    fVar377 = fStack_340 * fVar301 - fStack_1a0 * fVar190;
    fVar381 = fStack_33c * fVar302 - fStack_19c * fVar194;
    auVar316._8_4_ = auVar286._8_4_;
    auVar316._0_8_ = auVar286._0_8_;
    auVar316._12_4_ = auVar286._12_4_;
    auVar198 = maxps(auVar316,auVar334);
    bVar97 = fVar369 * fVar369 <=
             auVar198._0_4_ * auVar198._0_4_ * (fVar294 * fVar294 + fVar130 * fVar130) &&
             0.0 < (float)local_268._0_4_;
    auVar372._0_4_ = -(uint)bVar97;
    bVar98 = fVar374 * fVar374 <=
             auVar198._4_4_ * auVar198._4_4_ * (fVar299 * fVar299 + fVar185 * fVar185) &&
             1.0 < (float)local_268._0_4_;
    auVar372._4_4_ = -(uint)bVar98;
    bVar96 = fVar377 * fVar377 <=
             auVar198._8_4_ * auVar198._8_4_ * (fVar301 * fVar301 + fVar190 * fVar190) &&
             2.0 < (float)local_268._0_4_;
    auVar372._8_4_ = -(uint)bVar96;
    bVar95 = fVar381 * fVar381 <=
             auVar198._12_4_ * auVar198._12_4_ * (fVar302 * fVar302 + fVar194 * fVar194) &&
             3.0 < (float)local_268._0_4_;
    auVar372._12_4_ = -(uint)bVar95;
    local_448 = (float)uVar192;
    local_448 = local_448 * 4.7683716e-07;
    iVar180 = movmskps((int)local_330,auVar372);
    local_3c8 = fStack_3c4;
    fStack_3c0 = fStack_3c4;
    fStack_3bc = fStack_3c4;
    fVar369 = fVar307;
    fVar374 = fVar307;
    fVar377 = fVar307;
    fStack_314 = local_318;
    fStack_310 = local_318;
    fStack_30c = local_318;
    fStack_24c = fVar362;
    fStack_214 = local_218;
    fStack_210 = local_218;
    fStack_20c = local_218;
    fStack_204 = local_208;
    fStack_200 = local_208;
    fStack_1fc = local_208;
    fStack_1f4 = local_1f8;
    fStack_1f0 = local_1f8;
    fStack_1ec = local_1f8;
    fStack_194 = local_198;
    fStack_190 = local_198;
    fStack_18c = local_198;
    fStack_184 = local_188;
    fStack_180 = local_188;
    fStack_17c = local_188;
    local_168 = fVar356;
    fStack_164 = fVar356;
    fStack_160 = fVar356;
    fStack_15c = fVar356;
    local_158 = fStack_23c;
    fStack_154 = fStack_23c;
    fStack_150 = fStack_23c;
    fStack_14c = fStack_23c;
    local_148 = fStack_22c;
    fStack_144 = fStack_22c;
    fStack_140 = fStack_22c;
    fStack_13c = fStack_22c;
    if (iVar180 == 0) {
      bVar121 = 0;
    }
    else {
      fVar131 = fVar339 * fVar196 + fVar281 * fVar307 + fVar323 * fStack_3c4 + fVar368 * fVar320;
      fVar186 = fVar217 * fVar196 + fVar329 * fVar307 + fVar349 * fStack_3c4 + fVar373 * fVar320;
      fVar191 = fVar263 * fVar196 + fVar300 * fVar307 + fVar364 * fStack_3c4 + fVar376 * fVar320;
      fVar195 = fVar280 * fVar196 + fVar319 * fVar307 + fVar366 * fStack_3c4 + fVar380 * fVar320;
      local_2d8 = auVar75._0_4_;
      fStack_2d4 = auVar75._4_4_;
      fStack_2d0 = auVar75._8_4_;
      local_3a8._0_4_ = auVar72._0_4_;
      local_3a8._4_4_ = auVar72._4_4_;
      uStack_3a0._0_4_ = auVar72._8_4_;
      fVar251 = (float)local_3a8._0_4_ * fVar196 + local_2d8 * fVar307 + local_368 * fStack_3c4 +
                local_1b8 * fVar320;
      fVar260 = (float)local_3a8._4_4_ * fVar196 + fStack_2d4 * fVar307 + fStack_364 * fStack_3c4 +
                fStack_1b4 * fVar320;
      fVar261 = (float)uStack_3a0 * fVar196 + fStack_2d0 * fVar307 + fStack_360 * fStack_3c4 +
                fStack_1b0 * fVar320;
      fVar262 = fVar297 * fVar196 + fVar298 * fVar307 + fStack_35c * fStack_3c4 +
                fStack_1ac * fVar320;
      fVar339 = *(float *)(bezier_basis0 + lVar115 + 0x1210);
      fVar217 = *(float *)(bezier_basis0 + lVar115 + 0x1214);
      fVar263 = *(float *)(bezier_basis0 + lVar115 + 0x1218);
      fVar297 = *(float *)(bezier_basis0 + lVar115 + 0x121c);
      fVar280 = *(float *)(bezier_basis0 + lVar115 + 0x1694);
      fVar281 = *(float *)(bezier_basis0 + lVar115 + 0x1698);
      fVar329 = *(float *)(bezier_basis0 + lVar115 + 0x169c);
      fVar298 = *(float *)(bezier_basis0 + lVar115 + 0x16a0);
      fVar300 = *(float *)(bezier_basis0 + lVar115 + 0x1b18);
      fVar319 = *(float *)(bezier_basis0 + lVar115 + 0x1b1c);
      fVar323 = *(float *)(bezier_basis0 + lVar115 + 0x1b20);
      fVar349 = *(float *)(bezier_basis0 + lVar115 + 0x1b24);
      fVar364 = *(float *)(bezier_basis0 + lVar115 + 0x1f9c);
      fVar366 = *(float *)(bezier_basis0 + lVar115 + 0x1fa0);
      fVar368 = *(float *)(bezier_basis0 + lVar115 + 0x1fa4);
      fVar373 = *(float *)(bezier_basis0 + lVar115 + 0x1fa8);
      local_398._4_4_ = fVar307;
      local_398._0_4_ = fVar307;
      fStack_38c = fVar307;
      auVar70._4_4_ = local_188;
      auVar70._0_4_ = local_188;
      auVar70._8_4_ = local_188;
      auVar70._12_4_ = local_188;
      fVar330 = local_188 * fVar339 + local_218 * fVar280 + fVar357 * fVar300 + fVar219 * fVar364;
      fVar337 = local_188 * fVar217 + local_218 * fVar281 + fVar357 * fVar319 + fVar219 * fVar366;
      fVar340 = local_188 * fVar263 + local_218 * fVar329 + fVar357 * fVar323 + fVar219 * fVar368;
      fVar342 = local_188 * fVar297 + local_218 * fVar298 + fVar357 * fVar349 + fVar219 * fVar373;
      fVar370 = local_198 * fVar339 + local_318 * fVar280 + local_208 * fVar300 + fVar259 * fVar364;
      fVar375 = local_198 * fVar217 + local_318 * fVar281 + local_208 * fVar319 + fVar259 * fVar366;
      fVar378 = local_198 * fVar263 + local_318 * fVar329 + local_208 * fVar323 + fVar259 * fVar368;
      fVar382 = local_198 * fVar297 + local_318 * fVar298 + local_208 * fVar349 + fVar259 * fVar373;
      fVar376 = *(float *)(bezier_basis1 + lVar115 + 0x1210);
      fVar380 = *(float *)(bezier_basis1 + lVar115 + 0x1214);
      fVar381 = *(float *)(bezier_basis1 + lVar115 + 0x1218);
      fVar308 = *(float *)(bezier_basis1 + lVar115 + 0x121c);
      fVar379 = *(float *)(bezier_basis1 + lVar115 + 0x1b18);
      fVar383 = *(float *)(bezier_basis1 + lVar115 + 0x1b1c);
      fVar309 = *(float *)(bezier_basis1 + lVar115 + 0x1b20);
      fVar332 = *(float *)(bezier_basis1 + lVar115 + 0x1b24);
      fVar310 = *(float *)(bezier_basis1 + lVar115 + 0x1f9c);
      fVar341 = *(float *)(bezier_basis1 + lVar115 + 0x1fa0);
      fVar324 = *(float *)(bezier_basis1 + lVar115 + 0x1fa4);
      fVar326 = *(float *)(bezier_basis1 + lVar115 + 0x1fa8);
      fVar327 = *(float *)(bezier_basis1 + lVar115 + 0x1694);
      fVar328 = *(float *)(bezier_basis1 + lVar115 + 0x1698);
      fVar331 = *(float *)(bezier_basis1 + lVar115 + 0x169c);
      fVar338 = *(float *)(bezier_basis1 + lVar115 + 0x16a0);
      fVar358 = local_188 * fVar376 + local_218 * fVar327 + fVar357 * fVar379 + fVar219 * fVar310;
      fVar363 = local_188 * fVar380 + local_218 * fVar328 + fVar357 * fVar383 + fVar219 * fVar341;
      fVar365 = local_188 * fVar381 + local_218 * fVar331 + fVar357 * fVar309 + fVar219 * fVar324;
      fVar367 = local_188 * fVar308 + local_218 * fVar338 + fVar357 * fVar332 + fVar219 * fVar326;
      fVar197 = local_198 * fVar376 + local_318 * fVar327 + local_208 * fVar379 + fVar259 * fVar310;
      fVar218 = local_198 * fVar380 + local_318 * fVar328 + local_208 * fVar383 + fVar259 * fVar341;
      fVar220 = local_198 * fVar381 + local_318 * fVar331 + local_208 * fVar309 + fVar259 * fVar324;
      fVar221 = local_198 * fVar308 + local_318 * fVar338 + local_208 * fVar332 + fVar259 * fVar326;
      auVar345._0_8_ = CONCAT44(fVar337,fVar330) & 0x7fffffff7fffffff;
      auVar345._8_4_ = ABS(fVar340);
      auVar345._12_4_ = ABS(fVar342);
      auVar317._0_8_ = CONCAT44(fVar375,fVar370) & 0x7fffffff7fffffff;
      auVar317._8_4_ = ABS(fVar378);
      auVar317._12_4_ = ABS(fVar382);
      auVar198 = maxps(auVar345,auVar317);
      auVar351._0_8_ =
           CONCAT44(fVar217 * fVar320 + fVar281 * fStack_3c4 + fVar319 * fVar307 + fVar366 * fVar196
                    ,fVar339 * fVar320 +
                     fVar280 * fStack_3c4 + fVar300 * fVar307 + fVar364 * fVar196) &
           0x7fffffff7fffffff;
      auVar351._8_4_ =
           ABS(fVar263 * fVar320 + fVar329 * fStack_3c4 + fVar323 * fVar307 + fVar368 * fVar196);
      auVar351._12_4_ =
           ABS(fVar297 * fVar320 + fVar298 * fStack_3c4 + fVar349 * fVar307 + fVar373 * fVar196);
      auVar198 = maxps(auVar198,auVar351);
      uVar122 = -(uint)(local_448 <= auVar198._0_4_);
      uVar123 = -(uint)(local_448 <= auVar198._4_4_);
      uVar124 = -(uint)(local_448 <= auVar198._8_4_);
      uVar125 = -(uint)(local_448 <= auVar198._12_4_);
      fVar281 = (float)((uint)fVar330 & uVar122 | ~uVar122 & (uint)fVar294);
      fVar298 = (float)((uint)fVar337 & uVar123 | ~uVar123 & (uint)fVar299);
      fVar300 = (float)((uint)fVar340 & uVar124 | ~uVar124 & (uint)fVar301);
      fVar319 = (float)((uint)fVar342 & uVar125 | ~uVar125 & (uint)fVar302);
      fVar323 = (float)(~uVar122 & (uint)fVar130 | (uint)fVar370 & uVar122);
      fVar349 = (float)(~uVar123 & (uint)fVar185 | (uint)fVar375 & uVar123);
      fVar364 = (float)(~uVar124 & (uint)fVar190 | (uint)fVar378 & uVar124);
      fVar366 = (float)(~uVar125 & (uint)fVar194 | (uint)fVar382 & uVar125);
      auVar352._0_8_ = CONCAT44(fVar363,fVar358) & 0x7fffffff7fffffff;
      auVar352._8_4_ = ABS(fVar365);
      auVar352._12_4_ = ABS(fVar367);
      auVar322._0_8_ = CONCAT44(fVar218,fVar197) & 0x7fffffff7fffffff;
      auVar322._8_4_ = ABS(fVar220);
      auVar322._12_4_ = ABS(fVar221);
      auVar198 = maxps(auVar352,auVar322);
      auVar295._0_8_ =
           CONCAT44(fVar380 * fVar320 + fVar328 * fStack_3c4 + fVar383 * fVar307 + fVar341 * fVar196
                    ,fVar376 * fVar320 +
                     fVar327 * fStack_3c4 + fVar379 * fVar307 + fVar310 * fVar196) &
           0x7fffffff7fffffff;
      auVar295._8_4_ =
           ABS(fVar381 * fVar320 + fVar331 * fStack_3c4 + fVar309 * fVar307 + fVar324 * fVar196);
      auVar295._12_4_ =
           ABS(fVar308 * fVar320 + fVar338 * fStack_3c4 + fVar332 * fVar307 + fVar326 * fVar196);
      auVar198 = maxps(auVar198,auVar295);
      uVar122 = -(uint)(local_448 <= auVar198._0_4_);
      uVar123 = -(uint)(local_448 <= auVar198._4_4_);
      uVar124 = -(uint)(local_448 <= auVar198._8_4_);
      uVar125 = -(uint)(local_448 <= auVar198._12_4_);
      fVar309 = (float)((uint)fVar358 & uVar122 | ~uVar122 & (uint)fVar294);
      fVar332 = (float)((uint)fVar363 & uVar123 | ~uVar123 & (uint)fVar299);
      fVar310 = (float)((uint)fVar365 & uVar124 | ~uVar124 & (uint)fVar301);
      fVar341 = (float)((uint)fVar367 & uVar125 | ~uVar125 & (uint)fVar302);
      fVar368 = (float)(~uVar122 & (uint)fVar130 | (uint)fVar197 & uVar122);
      fVar373 = (float)(~uVar123 & (uint)fVar185 | (uint)fVar218 & uVar123);
      fVar381 = (float)(~uVar124 & (uint)fVar190 | (uint)fVar220 & uVar124);
      fVar308 = (float)(~uVar125 & (uint)fVar194 | (uint)fVar221 & uVar125);
      auVar213._0_4_ = fVar323 * fVar323 + fVar281 * fVar281;
      auVar213._4_4_ = fVar349 * fVar349 + fVar298 * fVar298;
      auVar213._8_4_ = fVar364 * fVar364 + fVar300 * fVar300;
      auVar213._12_4_ = fVar366 * fVar366 + fVar319 * fVar319;
      auVar198 = rsqrtps(auVar70,auVar213);
      fVar339 = auVar198._0_4_;
      fVar217 = auVar198._4_4_;
      fVar263 = auVar198._8_4_;
      fVar297 = auVar198._12_4_;
      auVar271._0_4_ = fVar339 * fVar339 * auVar213._0_4_ * 0.5 * fVar339;
      auVar271._4_4_ = fVar217 * fVar217 * auVar213._4_4_ * 0.5 * fVar217;
      auVar271._8_4_ = fVar263 * fVar263 * auVar213._8_4_ * 0.5 * fVar263;
      auVar271._12_4_ = fVar297 * fVar297 * auVar213._12_4_ * 0.5 * fVar297;
      fVar294 = fVar339 * 1.5 - auVar271._0_4_;
      fVar299 = fVar217 * 1.5 - auVar271._4_4_;
      fVar379 = fVar263 * 1.5 - auVar271._8_4_;
      fVar383 = fVar297 * 1.5 - auVar271._12_4_;
      auVar214._0_4_ = fVar368 * fVar368 + fVar309 * fVar309;
      auVar214._4_4_ = fVar373 * fVar373 + fVar332 * fVar332;
      auVar214._8_4_ = fVar381 * fVar381 + fVar310 * fVar310;
      auVar214._12_4_ = fVar308 * fVar308 + fVar341 * fVar341;
      auVar198 = rsqrtps(auVar271,auVar214);
      fVar339 = auVar198._0_4_;
      fVar217 = auVar198._4_4_;
      fVar263 = auVar198._8_4_;
      fVar297 = auVar198._12_4_;
      fVar339 = fVar339 * 1.5 - fVar339 * fVar339 * auVar214._0_4_ * 0.5 * fVar339;
      fVar280 = fVar217 * 1.5 - fVar217 * fVar217 * auVar214._4_4_ * 0.5 * fVar217;
      fVar263 = fVar263 * 1.5 - fVar263 * fVar263 * auVar214._8_4_ * 0.5 * fVar263;
      fVar329 = fVar297 * 1.5 - fVar297 * fVar297 * auVar214._12_4_ * 0.5 * fVar297;
      fVar376 = fVar323 * fVar294 * fVar282;
      fVar380 = fVar349 * fVar299 * fVar292;
      fVar301 = fVar364 * fVar379 * auVar286._8_4_;
      fVar302 = fVar366 * fVar383 * auVar286._12_4_;
      fVar217 = -fVar281 * fVar294 * fVar282;
      fVar297 = -fVar298 * fVar299 * fVar292;
      fVar281 = -fVar300 * fVar379 * auVar286._8_4_;
      fVar298 = -fVar319 * fVar383 * auVar286._12_4_;
      fVar340 = fVar294 * 0.0 * fVar282;
      fVar342 = fVar299 * 0.0 * fVar292;
      fVar358 = fVar379 * 0.0 * auVar286._8_4_;
      fVar363 = fVar383 * 0.0 * auVar286._12_4_;
      local_368 = fVar251 + fVar340;
      fStack_364 = fVar260 + fVar342;
      fStack_360 = fVar261 + fVar358;
      fStack_35c = fVar262 + fVar363;
      fVar294 = fVar368 * fVar339 * auVar334._0_4_;
      fVar299 = fVar373 * fVar280 * auVar334._4_4_;
      fVar379 = fVar381 * fVar263 * auVar334._8_4_;
      fVar383 = fVar308 * fVar329 * auVar334._12_4_;
      fVar324 = (float)local_228._0_4_ + fVar294;
      fVar326 = (float)local_228._4_4_ + fVar299;
      fVar327 = fStack_220 + fVar379;
      fVar328 = fStack_21c + fVar383;
      fVar300 = -fVar309 * fVar339 * auVar334._0_4_;
      fVar319 = -fVar332 * fVar280 * auVar334._4_4_;
      fVar323 = -fVar310 * fVar263 * auVar334._8_4_;
      fVar349 = -fVar341 * fVar329 * auVar334._12_4_;
      fVar331 = fVar129 + fVar300;
      fVar338 = fVar184 + fVar319;
      fVar197 = fVar189 + fVar323;
      fVar218 = fVar193 + fVar349;
      fVar364 = fVar339 * 0.0 * auVar334._0_4_;
      fVar366 = fVar280 * 0.0 * auVar334._4_4_;
      fVar368 = fVar263 * 0.0 * auVar334._8_4_;
      fVar373 = fVar329 * 0.0 * auVar334._12_4_;
      fVar381 = local_1a8 - fVar376;
      fVar308 = fStack_1a4 - fVar380;
      fVar309 = fStack_1a0 - fVar301;
      fVar310 = fStack_19c - fVar302;
      fVar220 = fVar131 + fVar364;
      fVar221 = fVar186 + fVar366;
      fVar330 = fVar191 + fVar368;
      fVar337 = fVar195 + fVar373;
      fVar339 = local_348 - fVar217;
      fVar263 = fStack_344 - fVar297;
      fVar280 = fStack_340 - fVar281;
      fVar329 = fStack_33c - fVar298;
      fVar251 = fVar251 - fVar340;
      fVar260 = fVar260 - fVar342;
      fVar261 = fVar261 - fVar358;
      fVar262 = fVar262 - fVar363;
      uVar122 = -(uint)(0.0 < (fVar339 * (fVar220 - fVar251) - fVar251 * (fVar331 - fVar339)) * 0.0
                              + (fVar251 * (fVar324 - fVar381) - (fVar220 - fVar251) * fVar381) *
                                0.0 + ((fVar331 - fVar339) * fVar381 - (fVar324 - fVar381) * fVar339
                                      ));
      uVar123 = -(uint)(0.0 < (fVar263 * (fVar221 - fVar260) - fVar260 * (fVar338 - fVar263)) * 0.0
                              + (fVar260 * (fVar326 - fVar308) - (fVar221 - fVar260) * fVar308) *
                                0.0 + ((fVar338 - fVar263) * fVar308 - (fVar326 - fVar308) * fVar263
                                      ));
      uVar124 = -(uint)(0.0 < (fVar280 * (fVar330 - fVar261) - fVar261 * (fVar197 - fVar280)) * 0.0
                              + (fVar261 * (fVar327 - fVar309) - (fVar330 - fVar261) * fVar309) *
                                0.0 + ((fVar197 - fVar280) * fVar309 - (fVar327 - fVar309) * fVar280
                                      ));
      uVar125 = -(uint)(0.0 < (fVar329 * (fVar337 - fVar262) - fVar262 * (fVar218 - fVar329)) * 0.0
                              + (fVar262 * (fVar328 - fVar310) - (fVar337 - fVar262) * fVar310) *
                                0.0 + ((fVar218 - fVar329) * fVar310 - (fVar328 - fVar310) * fVar329
                                      ));
      fVar294 = (float)((uint)((float)local_228._0_4_ - fVar294) & uVar122 |
                       ~uVar122 & (uint)(local_1a8 + fVar376));
      fVar299 = (float)((uint)((float)local_228._4_4_ - fVar299) & uVar123 |
                       ~uVar123 & (uint)(fStack_1a4 + fVar380));
      fVar301 = (float)((uint)(fStack_220 - fVar379) & uVar124 |
                       ~uVar124 & (uint)(fStack_1a0 + fVar301));
      fVar302 = (float)((uint)(fStack_21c - fVar383) & uVar125 |
                       ~uVar125 & (uint)(fStack_19c + fVar302));
      fVar300 = (float)((uint)(fVar129 - fVar300) & uVar122 | ~uVar122 & (uint)(local_348 + fVar217)
                       );
      fVar319 = (float)((uint)(fVar184 - fVar319) & uVar123 |
                       ~uVar123 & (uint)(fStack_344 + fVar297));
      fVar323 = (float)((uint)(fVar189 - fVar323) & uVar124 |
                       ~uVar124 & (uint)(fStack_340 + fVar281));
      fVar349 = (float)((uint)(fVar193 - fVar349) & uVar125 |
                       ~uVar125 & (uint)(fStack_33c + fVar298));
      fVar376 = (float)((uint)(fVar131 - fVar364) & uVar122 | ~uVar122 & (uint)local_368);
      fVar380 = (float)((uint)(fVar186 - fVar366) & uVar123 | ~uVar123 & (uint)fStack_364);
      fVar129 = (float)((uint)(fVar191 - fVar368) & uVar124 | ~uVar124 & (uint)fStack_360);
      fVar184 = (float)((uint)(fVar195 - fVar373) & uVar125 | ~uVar125 & (uint)fStack_35c);
      fVar379 = (float)((uint)fVar381 & uVar122 | ~uVar122 & (uint)fVar324);
      fVar383 = (float)((uint)fVar308 & uVar123 | ~uVar123 & (uint)fVar326);
      fVar332 = (float)((uint)fVar309 & uVar124 | ~uVar124 & (uint)fVar327);
      fVar341 = (float)((uint)fVar310 & uVar125 | ~uVar125 & (uint)fVar328);
      fVar217 = (float)((uint)fVar339 & uVar122 | ~uVar122 & (uint)fVar331);
      fVar297 = (float)((uint)fVar263 & uVar123 | ~uVar123 & (uint)fVar338);
      fVar281 = (float)((uint)fVar280 & uVar124 | ~uVar124 & (uint)fVar197);
      fVar298 = (float)((uint)fVar329 & uVar125 | ~uVar125 & (uint)fVar218);
      fVar364 = (float)((uint)fVar251 & uVar122 | ~uVar122 & (uint)fVar220);
      fVar366 = (float)((uint)fVar260 & uVar123 | ~uVar123 & (uint)fVar221);
      fVar368 = (float)((uint)fVar261 & uVar124 | ~uVar124 & (uint)fVar330);
      fVar373 = (float)((uint)fVar262 & uVar125 | ~uVar125 & (uint)fVar337);
      fVar324 = (float)((uint)fVar324 & uVar122 | ~uVar122 & (uint)fVar381) - fVar294;
      fVar326 = (float)((uint)fVar326 & uVar123 | ~uVar123 & (uint)fVar308) - fVar299;
      fVar309 = (float)((uint)fVar327 & uVar124 | ~uVar124 & (uint)fVar309) - fVar301;
      fVar310 = (float)((uint)fVar328 & uVar125 | ~uVar125 & (uint)fVar310) - fVar302;
      fVar327 = (float)((uint)fVar331 & uVar122 | ~uVar122 & (uint)fVar339) - fVar300;
      fVar328 = (float)((uint)fVar338 & uVar123 | ~uVar123 & (uint)fVar263) - fVar319;
      fVar331 = (float)((uint)fVar197 & uVar124 | ~uVar124 & (uint)fVar280) - fVar323;
      fVar338 = (float)((uint)fVar218 & uVar125 | ~uVar125 & (uint)fVar329) - fVar349;
      fVar131 = (float)((uint)fVar220 & uVar122 | ~uVar122 & (uint)fVar251) - fVar376;
      fVar186 = (float)((uint)fVar221 & uVar123 | ~uVar123 & (uint)fVar260) - fVar380;
      fVar191 = (float)((uint)fVar330 & uVar124 | ~uVar124 & (uint)fVar261) - fVar129;
      fVar195 = (float)((uint)fVar337 & uVar125 | ~uVar125 & (uint)fVar262) - fVar184;
      fVar251 = fVar294 - fVar379;
      fVar260 = fVar299 - fVar383;
      fVar261 = fVar301 - fVar332;
      fVar262 = fVar302 - fVar341;
      fVar189 = fVar300 - fVar217;
      fVar193 = fVar319 - fVar297;
      fVar381 = fVar323 - fVar281;
      fVar308 = fVar349 - fVar298;
      fVar339 = fVar376 - fVar364;
      fVar263 = fVar380 - fVar366;
      fVar280 = fVar129 - fVar368;
      fVar329 = fVar184 - fVar373;
      fVar197 = (fVar300 * fVar131 - fVar376 * fVar327) * 0.0 +
                (fVar376 * fVar324 - fVar294 * fVar131) * 0.0 +
                (fVar294 * fVar327 - fVar300 * fVar324);
      fVar218 = (fVar319 * fVar186 - fVar380 * fVar328) * 0.0 +
                (fVar380 * fVar326 - fVar299 * fVar186) * 0.0 +
                (fVar299 * fVar328 - fVar319 * fVar326);
      auVar255._4_4_ = fVar218;
      auVar255._0_4_ = fVar197;
      fVar220 = (fVar323 * fVar191 - fVar129 * fVar331) * 0.0 +
                (fVar129 * fVar309 - fVar301 * fVar191) * 0.0 +
                (fVar301 * fVar331 - fVar323 * fVar309);
      fVar221 = (fVar349 * fVar195 - fVar184 * fVar338) * 0.0 +
                (fVar184 * fVar310 - fVar302 * fVar195) * 0.0 +
                (fVar302 * fVar338 - fVar349 * fVar310);
      auVar360._0_4_ =
           (fVar217 * fVar339 - fVar364 * fVar189) * 0.0 +
           (fVar364 * fVar251 - fVar379 * fVar339) * 0.0 + (fVar379 * fVar189 - fVar217 * fVar251);
      auVar360._4_4_ =
           (fVar297 * fVar263 - fVar366 * fVar193) * 0.0 +
           (fVar366 * fVar260 - fVar383 * fVar263) * 0.0 + (fVar383 * fVar193 - fVar297 * fVar260);
      auVar360._8_4_ =
           (fVar281 * fVar280 - fVar368 * fVar381) * 0.0 +
           (fVar368 * fVar261 - fVar332 * fVar280) * 0.0 + (fVar332 * fVar381 - fVar281 * fVar261);
      auVar360._12_4_ =
           (fVar298 * fVar329 - fVar373 * fVar308) * 0.0 +
           (fVar373 * fVar262 - fVar341 * fVar329) * 0.0 + (fVar341 * fVar308 - fVar298 * fVar262);
      auVar255._8_4_ = fVar220;
      auVar255._12_4_ = fVar221;
      auVar198 = maxps(auVar255,auVar360);
      bVar97 = auVar198._0_4_ <= 0.0 && bVar97;
      auVar256._0_4_ = -(uint)bVar97;
      bVar98 = auVar198._4_4_ <= 0.0 && bVar98;
      auVar256._4_4_ = -(uint)bVar98;
      bVar96 = auVar198._8_4_ <= 0.0 && bVar96;
      auVar256._8_4_ = -(uint)bVar96;
      bVar95 = auVar198._12_4_ <= 0.0 && bVar95;
      auVar256._12_4_ = -(uint)bVar95;
      iVar180 = movmskps(iVar180,auVar256);
      if (iVar180 == 0) {
LAB_003a51b3:
        auVar176._8_8_ = uStack_320;
        auVar176._0_8_ = local_328;
      }
      else {
        fVar217 = ray->tfar;
        auVar272._0_4_ = fVar339 * fVar327;
        auVar272._4_4_ = fVar263 * fVar328;
        auVar272._8_4_ = fVar280 * fVar331;
        auVar272._12_4_ = fVar329 * fVar338;
        fVar366 = fVar189 * fVar131 - auVar272._0_4_;
        fVar368 = fVar193 * fVar186 - auVar272._4_4_;
        fVar373 = fVar381 * fVar191 - auVar272._8_4_;
        fVar379 = fVar308 * fVar195 - auVar272._12_4_;
        fVar339 = fVar339 * fVar324 - fVar131 * fVar251;
        fVar297 = fVar263 * fVar326 - fVar186 * fVar260;
        fVar281 = fVar280 * fVar309 - fVar191 * fVar261;
        fVar298 = fVar329 * fVar310 - fVar195 * fVar262;
        fVar189 = fVar251 * fVar327 - fVar189 * fVar324;
        fVar193 = fVar260 * fVar328 - fVar193 * fVar326;
        fVar381 = fVar261 * fVar331 - fVar381 * fVar309;
        fVar308 = fVar262 * fVar338 - fVar308 * fVar310;
        auVar287._0_4_ = fVar366 * 0.0 + fVar339 * 0.0 + fVar189;
        auVar287._4_4_ = fVar368 * 0.0 + fVar297 * 0.0 + fVar193;
        auVar287._8_4_ = fVar373 * 0.0 + fVar281 * 0.0 + fVar381;
        auVar287._12_4_ = fVar379 * 0.0 + fVar298 * 0.0 + fVar308;
        auVar198 = rcpps(auVar272,auVar287);
        fVar263 = auVar198._0_4_;
        fVar280 = auVar198._4_4_;
        fVar329 = auVar198._8_4_;
        fVar364 = auVar198._12_4_;
        fVar263 = (1.0 - auVar287._0_4_ * fVar263) * fVar263 + fVar263;
        fVar280 = (1.0 - auVar287._4_4_ * fVar280) * fVar280 + fVar280;
        fVar329 = (1.0 - auVar287._8_4_ * fVar329) * fVar329 + fVar329;
        fVar364 = (1.0 - auVar287._12_4_ * fVar364) * fVar364 + fVar364;
        fVar339 = (fVar376 * fVar189 + fVar300 * fVar339 + fVar294 * fVar366) * fVar263;
        fVar297 = (fVar380 * fVar193 + fVar319 * fVar297 + fVar299 * fVar368) * fVar280;
        aVar318.v[1] = fVar297;
        aVar318.v[0] = fVar339;
        fVar281 = (fVar129 * fVar381 + fVar323 * fVar281 + fVar301 * fVar373) * fVar329;
        fVar298 = (fVar184 * fVar308 + fVar349 * fVar298 + fVar302 * fVar379) * fVar364;
        bVar97 = (local_1f8 <= fVar339 && fVar339 <= fVar217) && bVar97;
        auVar273._0_4_ = -(uint)bVar97;
        bVar98 = (local_1f8 <= fVar297 && fVar297 <= fVar217) && bVar98;
        auVar273._4_4_ = -(uint)bVar98;
        bVar96 = (local_1f8 <= fVar281 && fVar281 <= fVar217) && bVar96;
        auVar273._8_4_ = -(uint)bVar96;
        bVar95 = (local_1f8 <= fVar298 && fVar298 <= fVar217) && bVar95;
        auVar273._12_4_ = -(uint)bVar95;
        iVar180 = movmskps(iVar180,auVar273);
        if (iVar180 == 0) goto LAB_003a51b3;
        auVar274._0_8_ =
             CONCAT44(-(uint)(auVar287._4_4_ != 0.0 && bVar98),
                      -(uint)(auVar287._0_4_ != 0.0 && bVar97));
        auVar274._8_4_ = -(uint)(auVar287._8_4_ != 0.0 && bVar96);
        auVar274._12_4_ = -(uint)(auVar287._12_4_ != 0.0 && bVar95);
        iVar180 = movmskps(iVar180,auVar274);
        auVar176._8_8_ = uStack_320;
        auVar176._0_8_ = local_328;
        if (iVar180 != 0) {
          fVar197 = fVar197 * fVar263;
          fVar218 = fVar218 * fVar280;
          fVar220 = fVar220 * fVar329;
          fVar221 = fVar221 * fVar364;
          local_3f8 = (float)((uint)(1.0 - fVar197) & uVar122 | ~uVar122 & (uint)fVar197);
          fStack_3f4 = (float)((uint)(1.0 - fVar218) & uVar123 | ~uVar123 & (uint)fVar218);
          fStack_3f0 = (float)((uint)(1.0 - fVar220) & uVar124 | ~uVar124 & (uint)fVar220);
          fStack_3ec = (float)((uint)(1.0 - fVar221) & uVar125 | ~uVar125 & (uint)fVar221);
          local_1d8 = (float)(~uVar122 & (uint)(auVar360._0_4_ * fVar263) |
                             (uint)(1.0 - auVar360._0_4_ * fVar263) & uVar122);
          fStack_1d4 = (float)(~uVar123 & (uint)(auVar360._4_4_ * fVar280) |
                              (uint)(1.0 - auVar360._4_4_ * fVar280) & uVar123);
          fStack_1d0 = (float)(~uVar124 & (uint)(auVar360._8_4_ * fVar329) |
                              (uint)(1.0 - auVar360._8_4_ * fVar329) & uVar124);
          fStack_1cc = (float)(~uVar125 & (uint)(auVar360._12_4_ * fVar364) |
                              (uint)(1.0 - auVar360._12_4_ * fVar364) & uVar125);
          auVar176._8_4_ = auVar274._8_4_;
          auVar176._0_8_ = auVar274._0_8_;
          auVar176._12_4_ = auVar274._12_4_;
          aVar318.v[2] = fVar281;
          aVar318.v[3] = fVar298;
          local_408 = aVar318;
        }
      }
      iVar180 = movmskps(iVar180,auVar176);
      _local_3a8 = auVar334;
      _local_378 = auVar286;
      local_1c8 = fVar130;
      fStack_1c4 = fVar185;
      fStack_1c0 = fVar190;
      fStack_1bc = fVar194;
      if (iVar180 == 0) {
        bVar121 = 0;
      }
      else {
        fVar282 = (auVar334._0_4_ - fVar282) * local_3f8 + fVar282;
        fVar292 = (auVar334._4_4_ - fVar292) * fStack_3f4 + fVar292;
        fVar217 = (auVar334._8_4_ - auVar286._8_4_) * fStack_3f0 + auVar286._8_4_;
        fVar263 = (auVar334._12_4_ - auVar286._12_4_) * fStack_3ec + auVar286._12_4_;
        fVar339 = local_330->depth_scale;
        aVar215._0_4_ = -(uint)(fVar339 * (fVar282 + fVar282) < local_408.v[0]) & auVar176._0_4_;
        aVar215._4_4_ = -(uint)(fVar339 * (fVar292 + fVar292) < local_408.v[1]) & auVar176._4_4_;
        aVar215._8_4_ = -(uint)(fVar339 * (fVar217 + fVar217) < local_408.v[2]) & auVar176._8_4_;
        aVar215._12_4_ = -(uint)(fVar339 * (fVar263 + fVar263) < local_408.v[3]) & auVar176._12_4_;
        uVar122 = movmskps((int)local_330,(undefined1  [16])aVar215);
        if (uVar122 != 0) {
          local_1d8 = local_1d8 + local_1d8 + -1.0;
          fStack_1d4 = fStack_1d4 + fStack_1d4 + -1.0;
          fStack_1d0 = fStack_1d0 + fStack_1d0 + -1.0;
          fStack_1cc = fStack_1cc + fStack_1cc + -1.0;
          bhit.i = 0;
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v0.field_0._0_8_ =
               CONCAT44(fVar343,fVar336);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v0.field_0._8_8_ =
               CONCAT44(fVar356,fVar348);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v1.field_0._0_8_ =
               CONCAT44(fStack_244,local_248);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v1.field_0._8_8_ =
               CONCAT44(fStack_23c,fStack_240);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v2.field_0._0_8_ =
               CONCAT44(fStack_254,local_258);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v2.field_0._8_8_ =
               CONCAT44(fVar362,fStack_250);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v3.field_0._0_8_ =
               CONCAT44(fStack_234,local_238);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v3.field_0._8_8_ =
               CONCAT44(fStack_22c,fStack_230);
          pRVar111 = (RTCIntersectArguments *)(ulong)(uint)ray->mask;
          bhit.U.field_0.v[0] = local_3f8;
          bhit.U.field_0.v[1] = fStack_3f4;
          bhit.U.field_0.v[2] = fStack_3f0;
          bhit.U.field_0.v[3] = fStack_3ec;
          bhit.V.field_0.v[0] = local_1d8;
          bhit.V.field_0.v[1] = fStack_1d4;
          bhit.V.field_0.v[2] = fStack_1d0;
          bhit.V.field_0.v[3] = fStack_1cc;
          bhit.T.field_0 = local_408;
          bhit.N = iVar249;
          bhit.valid.field_0 = aVar215;
          if ((pGVar26->mask & ray->mask) != 0) {
            if ((pRVar107->args->filter != (RTCFilterFunctionN)0x0) ||
               (bVar121 = 1, pRVar111 = pRVar107->args,
               pGVar26->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              fVar339 = 1.0 / (float)local_268._0_4_;
              bhit.vu.field_0.v[0] = fVar339 * (local_3f8 + 0.0);
              bhit.vu.field_0.v[1] = fVar339 * (fStack_3f4 + 1.0);
              bhit.vu.field_0.v[2] = fVar339 * (fStack_3f0 + 2.0);
              bhit.vu.field_0.v[3] = fVar339 * (fStack_3ec + 3.0);
              bhit.vv.field_0._0_8_ = CONCAT44(fStack_1d4,local_1d8);
              bhit.vv.field_0._8_8_ = CONCAT44(fStack_1cc,fStack_1d0);
              bhit.vt.field_0 = local_408;
              uVar110 = (ulong)(uVar122 & 0xff);
              uVar112 = 0;
              local_380 = lVar119;
              if (uVar110 != 0) {
                for (; ((uVar122 & 0xff) >> uVar112 & 1) == 0; uVar112 = uVar112 + 1) {
                }
              }
              while (uVar110 != 0) {
                local_29c = bhit.vu.field_0.v[uVar112];
                local_298 = bhit.vv.field_0.v[uVar112];
                fVar339 = ray->tfar;
                ray->tfar = bhit.vt.field_0.v[uVar112];
                args.context = local_3b0->user;
                fVar217 = 1.0 - local_29c;
                fVar297 = local_29c * fVar217 + local_29c * fVar217;
                fVar263 = fVar217 * fVar217 * -3.0;
                fVar280 = (fVar217 * fVar217 - fVar297) * 3.0;
                fVar217 = (fVar297 - local_29c * local_29c) * 3.0;
                fVar297 = local_29c * local_29c * 3.0;
                local_2a8 = CONCAT44(fVar263 * fVar343 +
                                     fVar280 * fStack_244 +
                                     fVar217 * fStack_254 + fVar297 * fStack_234,
                                     fVar263 * fVar336 +
                                     fVar280 * local_248 + fVar217 * local_258 + fVar297 * local_238
                                    );
                local_2a0 = fVar263 * fVar348 +
                            fVar280 * fStack_240 + fVar217 * fStack_250 + fVar297 * fStack_230;
                local_294 = SUB84(local_270,0);
                local_290 = SUB84(local_350,0);
                local_28c = (args.context)->instID[0];
                local_288 = (args.context)->instPrimID[0];
                local_40c = -1;
                args.valid = &local_40c;
                args.geometryUserPtr = pGVar26->userPtr;
                args.hit = (RTCHitN *)&local_2a8;
                args.N = 1;
                pRVar114 = local_270;
                args.ray = (RTCRayN *)ray;
                if ((pGVar26->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                   ((*pGVar26->occlusionFilterN)(&args), pRVar114 = extraout_RDX, *args.valid != 0))
                {
                  pRVar111 = local_3b0->args;
                  if ((pRVar111->filter == (RTCFilterFunctionN)0x0) ||
                     ((((pRVar111->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT &&
                       (((pGVar26->field_8).field_0x2 & 0x40) == 0)) ||
                      ((*pRVar111->filter)(&args), pRVar114 = extraout_RDX_00, *args.valid != 0))))
                  {
                    bVar121 = 1;
                    lVar119 = local_380;
                    fVar307 = (float)local_398._0_4_;
                    fVar369 = (float)local_398._4_4_;
                    fVar374 = fStack_390;
                    fVar377 = fStack_38c;
                    goto LAB_003a517e;
                  }
                }
                ray->tfar = fVar339;
                uVar110 = uVar110 ^ 1L << (uVar112 & 0x3f);
                uVar112 = 0;
                if (uVar110 != 0) {
                  for (; (uVar110 >> uVar112 & 1) == 0; uVar112 = uVar112 + 1) {
                  }
                }
                fVar307 = (float)local_398._0_4_;
                fVar369 = (float)local_398._4_4_;
                fVar374 = fStack_390;
                fVar377 = fStack_38c;
              }
              bVar121 = 0;
              pRVar111 = local_350;
              lVar119 = local_380;
            }
            goto LAB_003a517e;
          }
        }
        bVar121 = 0;
      }
    }
LAB_003a517e:
    uVar116 = SUB84(pRVar111,0);
    if (4 < iVar249) {
      fVar339 = 1.0 / (float)local_268._0_4_;
      local_398._4_4_ = fVar369;
      local_398._0_4_ = fVar307;
      fStack_390 = fVar374;
      fStack_38c = fVar377;
      pRVar118 = local_350;
      for (lVar120 = 4; uVar116 = SUB84(pRVar111,0), lVar120 < lVar119; lVar120 = lVar120 + 4) {
        uVar123 = (uint)lVar120;
        pRVar111 = (RTCIntersectArguments *)(bezier_basis0 + lVar115);
        pRVar8 = &pRVar111->flags + lVar120;
        fVar217 = (float)*pRVar8;
        fVar263 = (float)pRVar8[1];
        fVar297 = (float)pRVar8[2];
        fVar280 = (float)pRVar8[3];
        pfVar1 = (float *)(lVar115 + 0x21fb768 + lVar120 * 4);
        local_1b8 = *pfVar1;
        fStack_1b4 = pfVar1[1];
        fStack_1b0 = pfVar1[2];
        fStack_1ac = pfVar1[3];
        pfVar1 = (float *)(lVar115 + 0x21fbbec + lVar120 * 4);
        local_1c8 = *pfVar1;
        fStack_1c4 = pfVar1[1];
        fStack_1c0 = pfVar1[2];
        fStack_1bc = pfVar1[3];
        pfVar1 = (float *)(lVar115 + 0x21fc070 + lVar120 * 4);
        local_348 = *pfVar1;
        fStack_344 = pfVar1[1];
        fStack_340 = pfVar1[2];
        fStack_33c = pfVar1[3];
        fVar185 = local_188 * fVar217 +
                  local_218 * local_1b8 + fVar357 * local_1c8 + fVar219 * local_348;
        fVar190 = fStack_184 * fVar263 +
                  fStack_214 * fStack_1b4 + fVar357 * fStack_1c4 + fVar219 * fStack_344;
        fVar194 = fStack_180 * fVar297 +
                  fStack_210 * fStack_1b0 + fVar357 * fStack_1c0 + fVar219 * fStack_340;
        fVar292 = fStack_17c * fVar280 +
                  fStack_20c * fStack_1ac + fVar357 * fStack_1bc + fVar219 * fStack_33c;
        local_1a8 = local_198 * fVar217 +
                    local_318 * local_1b8 + local_208 * local_1c8 + fVar259 * local_348;
        fStack_1a4 = fStack_194 * fVar263 +
                     fStack_314 * fStack_1b4 + fStack_204 * fStack_1c4 + fVar259 * fStack_344;
        fStack_1a0 = fStack_190 * fVar297 +
                     fStack_310 * fStack_1b0 + fStack_200 * fStack_1c0 + fVar259 * fStack_340;
        fStack_19c = fStack_18c * fVar280 +
                     fStack_30c * fStack_1ac + fStack_1fc * fStack_1bc + fVar259 * fStack_33c;
        local_3a8._0_4_ =
             local_168 * fVar217 +
             local_158 * local_1b8 + fVar362 * local_1c8 + local_148 * local_348;
        local_3a8._4_4_ =
             fStack_164 * fVar263 +
             fStack_154 * fStack_1b4 + fVar362 * fStack_1c4 + fStack_144 * fStack_344;
        uStack_3a0._0_4_ =
             fStack_160 * fVar297 +
             fStack_150 * fStack_1b0 + fVar362 * fStack_1c0 + fStack_140 * fStack_340;
        register0x000012cc =
             fStack_15c * fVar280 +
             fStack_14c * fStack_1ac + fVar362 * fStack_1bc + fStack_13c * fStack_33c;
        pfVar1 = (float *)(bezier_basis1 + lVar115 + lVar120 * 4);
        fVar281 = *pfVar1;
        fVar329 = pfVar1[1];
        fVar298 = pfVar1[2];
        fVar300 = pfVar1[3];
        pfVar1 = (float *)(lVar115 + 0x21fdb88 + lVar120 * 4);
        fVar307 = *pfVar1;
        fVar319 = pfVar1[1];
        fVar323 = pfVar1[2];
        fVar349 = pfVar1[3];
        pfVar1 = (float *)(lVar115 + 0x21fe00c + lVar120 * 4);
        fVar364 = *pfVar1;
        fVar366 = pfVar1[1];
        fVar368 = pfVar1[2];
        fVar373 = pfVar1[3];
        pfVar1 = (float *)(lVar115 + 0x21fe490 + lVar120 * 4);
        fVar376 = *pfVar1;
        fVar380 = pfVar1[1];
        fVar369 = pfVar1[2];
        fVar374 = pfVar1[3];
        fVar377 = local_188 * fVar281 + local_218 * fVar307 + fVar357 * fVar364 + fVar219 * fVar376;
        fVar129 = fStack_184 * fVar329 +
                  fStack_214 * fVar319 + fVar357 * fVar366 + fVar219 * fVar380;
        fVar130 = fStack_180 * fVar298 +
                  fStack_210 * fVar323 + fVar357 * fVar368 + fVar219 * fVar369;
        fVar184 = fStack_17c * fVar300 +
                  fStack_20c * fVar349 + fVar357 * fVar373 + fVar219 * fVar374;
        fVar308 = local_198 * fVar281 +
                  local_318 * fVar307 + local_208 * fVar364 + fVar259 * fVar376;
        fVar379 = fStack_194 * fVar329 +
                  fStack_314 * fVar319 + fStack_204 * fVar366 + fVar259 * fVar380;
        fVar383 = fStack_190 * fVar298 +
                  fStack_310 * fVar323 + fStack_200 * fVar368 + fVar259 * fVar369;
        fVar309 = fStack_18c * fVar300 +
                  fStack_30c * fVar349 + fStack_1fc * fVar373 + fVar259 * fVar374;
        auVar353._0_4_ =
             local_168 * fVar281 + local_158 * fVar307 + fVar362 * fVar364 + local_148 * fVar376;
        auVar353._4_4_ =
             fStack_164 * fVar329 + fStack_154 * fVar319 + fVar362 * fVar366 + fStack_144 * fVar380;
        auVar353._8_4_ =
             fStack_160 * fVar298 + fStack_150 * fVar323 + fVar362 * fVar368 + fStack_140 * fVar369;
        auVar353._12_4_ =
             fStack_15c * fVar300 + fStack_14c * fVar349 + fVar362 * fVar373 + fStack_13c * fVar374;
        fVar189 = fVar377 - fVar185;
        fVar193 = fVar129 - fVar190;
        fVar282 = fVar130 - fVar194;
        fVar294 = fVar184 - fVar292;
        local_368 = fVar308 - local_1a8;
        fStack_364 = fVar379 - fStack_1a4;
        fStack_360 = fVar383 - fStack_1a0;
        fStack_35c = fVar309 - fStack_19c;
        fVar299 = local_1a8 * fVar189 - fVar185 * local_368;
        fVar301 = fStack_1a4 * fVar193 - fVar190 * fStack_364;
        fVar302 = fStack_1a0 * fVar282 - fVar194 * fStack_360;
        fVar381 = fStack_19c * fVar294 - fVar292 * fStack_35c;
        auVar198 = maxps(_local_3a8,auVar353);
        bVar95 = fVar299 * fVar299 <=
                 auVar198._0_4_ * auVar198._0_4_ * (fVar189 * fVar189 + local_368 * local_368) &&
                 (int)uVar123 < iVar249;
        auVar346._0_4_ = -(uint)bVar95;
        bVar96 = fVar301 * fVar301 <=
                 auVar198._4_4_ * auVar198._4_4_ * (fVar193 * fVar193 + fStack_364 * fStack_364) &&
                 (int)(uVar123 | 1) < iVar249;
        auVar346._4_4_ = -(uint)bVar96;
        bVar97 = fVar302 * fVar302 <=
                 auVar198._8_4_ * auVar198._8_4_ * (fVar282 * fVar282 + fStack_360 * fStack_360) &&
                 (int)(uVar123 | 2) < iVar249;
        auVar346._8_4_ = -(uint)bVar97;
        bVar98 = fVar381 * fVar381 <=
                 auVar198._12_4_ * auVar198._12_4_ * (fVar294 * fVar294 + fStack_35c * fStack_35c)
                 && (int)(uVar123 | 3) < iVar249;
        auVar346._12_4_ = -(uint)bVar98;
        uVar122 = movmskps((int)pRVar114,auVar346);
        pRVar114 = (RayQueryContext *)(ulong)uVar122;
        if (uVar122 != 0) {
          fVar195 = fVar376 * fVar196 + fVar364 * (float)local_398._0_4_ + fVar307 * local_3c8 +
                    fVar281 * fVar320;
          fVar197 = fVar380 * fVar196 + fVar366 * (float)local_398._4_4_ + fVar319 * fStack_3c4 +
                    fVar329 * fVar320;
          fVar218 = fVar369 * fVar196 + fVar368 * fStack_390 + fVar323 * fStack_3c0 +
                    fVar298 * fVar320;
          fVar220 = fVar374 * fVar196 + fVar373 * fStack_38c + fVar349 * fStack_3bc +
                    fVar300 * fVar320;
          fVar221 = local_348 * fVar196 + local_1c8 * (float)local_398._0_4_ + local_1b8 * local_3c8
                    + fVar217 * fVar320;
          fVar251 = fStack_344 * fVar196 + fStack_1c4 * (float)local_398._4_4_ +
                    fStack_1b4 * fStack_3c4 + fVar263 * fVar320;
          fVar260 = fStack_340 * fVar196 + fStack_1c0 * fStack_390 + fStack_1b0 * fStack_3c0 +
                    fVar297 * fVar320;
          fVar261 = fStack_33c * fVar196 + fStack_1bc * fStack_38c + fStack_1ac * fStack_3bc +
                    fVar280 * fVar320;
          pfVar1 = (float *)(lVar115 + 0x21fc4f4 + lVar120 * 4);
          fVar217 = *pfVar1;
          fVar263 = pfVar1[1];
          fVar297 = pfVar1[2];
          fVar280 = pfVar1[3];
          pfVar1 = (float *)(lVar115 + 0x21fc978 + lVar120 * 4);
          fVar281 = *pfVar1;
          fVar329 = pfVar1[1];
          fVar298 = pfVar1[2];
          fVar300 = pfVar1[3];
          pfVar1 = (float *)(lVar115 + 0x21fcdfc + lVar120 * 4);
          fVar307 = *pfVar1;
          fVar319 = pfVar1[1];
          fVar323 = pfVar1[2];
          fVar349 = pfVar1[3];
          pfVar1 = (float *)(lVar115 + 0x21fd280 + lVar120 * 4);
          fVar364 = *pfVar1;
          fVar366 = pfVar1[1];
          fVar368 = pfVar1[2];
          fVar373 = pfVar1[3];
          fVar262 = local_188 * fVar217 +
                    local_218 * fVar281 + fVar357 * fVar307 + fVar219 * fVar364;
          fVar330 = fStack_184 * fVar263 +
                    fStack_214 * fVar329 + fVar357 * fVar319 + fVar219 * fVar366;
          fVar337 = fStack_180 * fVar297 +
                    fStack_210 * fVar298 + fVar357 * fVar323 + fVar219 * fVar368;
          fVar340 = fStack_17c * fVar280 +
                    fStack_20c * fVar300 + fVar357 * fVar349 + fVar219 * fVar373;
          fVar338 = local_198 * fVar217 +
                    local_318 * fVar281 + local_208 * fVar307 + fVar259 * fVar364;
          fVar131 = fStack_194 * fVar263 +
                    fStack_314 * fVar329 + fStack_204 * fVar319 + fVar259 * fVar366;
          fVar186 = fStack_190 * fVar297 +
                    fStack_310 * fVar298 + fStack_200 * fVar323 + fVar259 * fVar368;
          fVar191 = fStack_18c * fVar280 +
                    fStack_30c * fVar300 + fStack_1fc * fVar349 + fVar259 * fVar373;
          pfVar1 = (float *)(lVar115 + 0x21fe914 + lVar120 * 4);
          fVar376 = *pfVar1;
          fVar380 = pfVar1[1];
          fVar369 = pfVar1[2];
          fVar374 = pfVar1[3];
          pfVar1 = (float *)(lVar115 + 0x21ff21c + lVar120 * 4);
          fVar299 = *pfVar1;
          fVar301 = pfVar1[1];
          fVar302 = pfVar1[2];
          fVar381 = pfVar1[3];
          pfVar1 = (float *)(lVar115 + 0x21ff6a0 + lVar120 * 4);
          fVar332 = *pfVar1;
          fVar310 = pfVar1[1];
          fVar341 = pfVar1[2];
          fVar324 = pfVar1[3];
          pfVar1 = (float *)(lVar115 + 0x21fed98 + lVar120 * 4);
          fVar326 = *pfVar1;
          fVar327 = pfVar1[1];
          fVar328 = pfVar1[2];
          fVar331 = pfVar1[3];
          fVar342 = local_188 * fVar376 +
                    local_218 * fVar326 + fVar357 * fVar299 + fVar219 * fVar332;
          fVar358 = fStack_184 * fVar380 +
                    fStack_214 * fVar327 + fVar357 * fVar301 + fVar219 * fVar310;
          fVar363 = fStack_180 * fVar369 +
                    fStack_210 * fVar328 + fVar357 * fVar302 + fVar219 * fVar341;
          fVar365 = fStack_17c * fVar374 +
                    fStack_20c * fVar331 + fVar357 * fVar381 + fVar219 * fVar324;
          fVar367 = local_198 * fVar376 +
                    local_318 * fVar326 + local_208 * fVar299 + fVar259 * fVar332;
          fVar370 = fStack_194 * fVar380 +
                    fStack_314 * fVar327 + fStack_204 * fVar301 + fVar259 * fVar310;
          fVar375 = fStack_190 * fVar369 +
                    fStack_310 * fVar328 + fStack_200 * fVar302 + fVar259 * fVar341;
          fVar378 = fStack_18c * fVar374 +
                    fStack_30c * fVar331 + fStack_1fc * fVar381 + fVar259 * fVar324;
          auVar347._0_8_ = CONCAT44(fVar330,fVar262) & 0x7fffffff7fffffff;
          auVar347._8_4_ = ABS(fVar337);
          auVar347._12_4_ = ABS(fVar340);
          auVar288._0_8_ = CONCAT44(fVar131,fVar338) & 0x7fffffff7fffffff;
          auVar288._8_4_ = ABS(fVar186);
          auVar288._12_4_ = ABS(fVar191);
          auVar198 = maxps(auVar347,auVar288);
          auVar354._0_8_ =
               CONCAT44(fVar263 * fVar320 +
                        fVar329 * fStack_3c4 + fVar319 * (float)local_398._4_4_ + fVar366 * fVar196,
                        fVar217 * fVar320 +
                        fVar281 * local_3c8 + fVar307 * (float)local_398._0_4_ + fVar364 * fVar196)
               & 0x7fffffff7fffffff;
          auVar354._8_4_ =
               ABS(fVar297 * fVar320 +
                   fVar298 * fStack_3c0 + fVar323 * fStack_390 + fVar368 * fVar196);
          auVar354._12_4_ =
               ABS(fVar280 * fVar320 +
                   fVar300 * fStack_3bc + fVar349 * fStack_38c + fVar373 * fVar196);
          auVar198 = maxps(auVar198,auVar354);
          uVar122 = -(uint)(local_448 <= auVar198._0_4_);
          uVar124 = -(uint)(local_448 <= auVar198._4_4_);
          uVar125 = -(uint)(local_448 <= auVar198._8_4_);
          uVar126 = -(uint)(local_448 <= auVar198._12_4_);
          auVar289._0_4_ = ~uVar122 & (uint)fVar189;
          auVar289._4_4_ = ~uVar124 & (uint)fVar193;
          auVar289._8_4_ = ~uVar125 & (uint)fVar282;
          auVar289._12_4_ = ~uVar126 & (uint)fVar294;
          auVar335._0_4_ = (uint)fVar262 & uVar122;
          auVar335._4_4_ = (uint)fVar330 & uVar124;
          auVar335._8_4_ = (uint)fVar337 & uVar125;
          auVar335._12_4_ = (uint)fVar340 & uVar126;
          auVar335 = auVar335 | auVar289;
          fVar319 = (float)(~uVar122 & (uint)local_368 | (uint)fVar338 & uVar122);
          fVar349 = (float)(~uVar124 & (uint)fStack_364 | (uint)fVar131 & uVar124);
          fVar338 = (float)(~uVar125 & (uint)fStack_360 | (uint)fVar186 & uVar125);
          fVar131 = (float)(~uVar126 & (uint)fStack_35c | (uint)fVar191 & uVar126);
          auVar355._0_8_ = CONCAT44(fVar358,fVar342) & 0x7fffffff7fffffff;
          auVar355._8_4_ = ABS(fVar363);
          auVar355._12_4_ = ABS(fVar365);
          auVar244._0_8_ = CONCAT44(fVar370,fVar367) & 0x7fffffff7fffffff;
          auVar244._8_4_ = ABS(fVar375);
          auVar244._12_4_ = ABS(fVar378);
          auVar198 = maxps(auVar355,auVar244);
          auVar177._0_8_ =
               CONCAT44(fVar380 * fVar320 +
                        fVar327 * fStack_3c4 + fVar301 * (float)local_398._4_4_ + fVar310 * fVar196,
                        fVar376 * fVar320 +
                        fVar326 * local_3c8 + fVar299 * (float)local_398._0_4_ + fVar332 * fVar196)
               & 0x7fffffff7fffffff;
          auVar177._8_4_ =
               ABS(fVar369 * fVar320 +
                   fVar328 * fStack_3c0 + fVar302 * fStack_390 + fVar341 * fVar196);
          auVar177._12_4_ =
               ABS(fVar374 * fVar320 +
                   fVar331 * fStack_3bc + fVar381 * fStack_38c + fVar324 * fVar196);
          auVar198 = maxps(auVar198,auVar177);
          uVar122 = -(uint)(local_448 <= auVar198._0_4_);
          uVar124 = -(uint)(local_448 <= auVar198._4_4_);
          uVar125 = -(uint)(local_448 <= auVar198._8_4_);
          uVar126 = -(uint)(local_448 <= auVar198._12_4_);
          fVar332 = (float)((uint)fVar342 & uVar122 | ~uVar122 & (uint)fVar189);
          fVar310 = (float)((uint)fVar358 & uVar124 | ~uVar124 & (uint)fVar193);
          fVar341 = (float)((uint)fVar363 & uVar125 | ~uVar125 & (uint)fVar282);
          fVar324 = (float)((uint)fVar365 & uVar126 | ~uVar126 & (uint)fVar294);
          fVar376 = (float)(~uVar122 & (uint)local_368 | (uint)fVar367 & uVar122);
          fVar369 = (float)(~uVar124 & (uint)fStack_364 | (uint)fVar370 & uVar124);
          fVar189 = (float)(~uVar125 & (uint)fStack_360 | (uint)fVar375 & uVar125);
          fVar193 = (float)(~uVar126 & (uint)fStack_35c | (uint)fVar378 & uVar126);
          fVar300 = auVar335._0_4_;
          fVar217 = auVar335._4_4_;
          fVar263 = auVar335._8_4_;
          fVar297 = auVar335._12_4_;
          auVar275._0_4_ = fVar319 * fVar319 + fVar300 * fVar300;
          auVar275._4_4_ = fVar349 * fVar349 + fVar217 * fVar217;
          auVar275._8_4_ = fVar338 * fVar338 + fVar263 * fVar263;
          auVar275._12_4_ = fVar131 * fVar131 + fVar297 * fVar297;
          auVar198 = rsqrtps(auVar289,auVar275);
          fVar280 = auVar198._0_4_;
          fVar281 = auVar198._4_4_;
          fVar329 = auVar198._8_4_;
          fVar298 = auVar198._12_4_;
          auVar290._0_4_ = fVar280 * fVar280 * auVar275._0_4_ * 0.5 * fVar280;
          auVar290._4_4_ = fVar281 * fVar281 * auVar275._4_4_ * 0.5 * fVar281;
          auVar290._8_4_ = fVar329 * fVar329 * auVar275._8_4_ * 0.5 * fVar329;
          auVar290._12_4_ = fVar298 * fVar298 * auVar275._12_4_ * 0.5 * fVar298;
          fVar364 = fVar280 * 1.5 - auVar290._0_4_;
          fVar366 = fVar281 * 1.5 - auVar290._4_4_;
          fVar368 = fVar329 * 1.5 - auVar290._8_4_;
          fVar373 = fVar298 * 1.5 - auVar290._12_4_;
          auVar276._0_4_ = fVar376 * fVar376 + fVar332 * fVar332;
          auVar276._4_4_ = fVar369 * fVar369 + fVar310 * fVar310;
          auVar276._8_4_ = fVar189 * fVar189 + fVar341 * fVar341;
          auVar276._12_4_ = fVar193 * fVar193 + fVar324 * fVar324;
          auVar198 = rsqrtps(auVar290,auVar276);
          fVar280 = auVar198._0_4_;
          fVar281 = auVar198._4_4_;
          fVar329 = auVar198._8_4_;
          fVar298 = auVar198._12_4_;
          fVar307 = fVar280 * 1.5 - fVar280 * fVar280 * auVar276._0_4_ * 0.5 * fVar280;
          fVar281 = fVar281 * 1.5 - fVar281 * fVar281 * auVar276._4_4_ * 0.5 * fVar281;
          fVar323 = fVar329 * 1.5 - fVar329 * fVar329 * auVar276._8_4_ * 0.5 * fVar329;
          fVar298 = fVar298 * 1.5 - fVar298 * fVar298 * auVar276._12_4_ * 0.5 * fVar298;
          fVar326 = fVar319 * fVar364 * (float)local_3a8._0_4_;
          fVar328 = fVar349 * fVar366 * (float)local_3a8._4_4_;
          fVar338 = fVar338 * fVar368 * (float)uStack_3a0;
          fVar186 = fVar131 * fVar373 * register0x000012cc;
          fVar329 = -fVar300 * fVar364 * (float)local_3a8._0_4_;
          fVar300 = -fVar217 * fVar366 * (float)local_3a8._4_4_;
          fVar319 = -fVar263 * fVar368 * (float)uStack_3a0;
          fVar349 = -fVar297 * fVar373 * register0x000012cc;
          fVar380 = fVar364 * 0.0 * (float)local_3a8._0_4_;
          fVar374 = fVar366 * 0.0 * (float)local_3a8._4_4_;
          fVar282 = fVar368 * 0.0 * (float)uStack_3a0;
          fVar294 = fVar373 * 0.0 * register0x000012cc;
          local_348 = fVar221 + fVar380;
          fStack_344 = fVar251 + fVar374;
          fStack_340 = fVar260 + fVar282;
          fStack_33c = fVar261 + fVar294;
          fVar262 = fVar376 * fVar307 * auVar353._0_4_;
          fVar330 = fVar369 * fVar281 * auVar353._4_4_;
          fVar337 = fVar189 * fVar323 * auVar353._8_4_;
          fVar340 = fVar193 * fVar298 * auVar353._12_4_;
          fVar299 = fVar377 + fVar262;
          fVar301 = fVar129 + fVar330;
          fVar302 = fVar130 + fVar337;
          fVar381 = fVar184 + fVar340;
          fVar217 = -fVar332 * fVar307 * auVar353._0_4_;
          fVar263 = -fVar310 * fVar281 * auVar353._4_4_;
          fVar297 = -fVar341 * fVar323 * auVar353._8_4_;
          fVar280 = -fVar324 * fVar298 * auVar353._12_4_;
          fVar332 = fVar308 + fVar217;
          fVar310 = fVar379 + fVar263;
          fVar341 = fVar383 + fVar297;
          fVar324 = fVar309 + fVar280;
          fVar364 = fVar307 * 0.0 * auVar353._0_4_;
          fVar366 = fVar281 * 0.0 * auVar353._4_4_;
          fVar368 = fVar323 * 0.0 * auVar353._8_4_;
          fVar373 = fVar298 * 0.0 * auVar353._12_4_;
          fVar281 = fVar185 - fVar326;
          fVar298 = fVar190 - fVar328;
          fVar307 = fVar194 - fVar338;
          fVar323 = fVar292 - fVar186;
          fVar327 = fVar195 + fVar364;
          fVar331 = fVar197 + fVar366;
          fVar131 = fVar218 + fVar368;
          fVar191 = fVar220 + fVar373;
          fVar376 = local_1a8 - fVar329;
          fVar369 = fStack_1a4 - fVar300;
          fVar189 = fStack_1a0 - fVar319;
          fVar193 = fStack_19c - fVar349;
          fVar221 = fVar221 - fVar380;
          fVar251 = fVar251 - fVar374;
          fVar260 = fVar260 - fVar282;
          fVar261 = fVar261 - fVar294;
          uVar122 = -(uint)(0.0 < (fVar376 * (fVar327 - fVar221) - fVar221 * (fVar332 - fVar376)) *
                                  0.0 + (fVar221 * (fVar299 - fVar281) -
                                        (fVar327 - fVar221) * fVar281) * 0.0 +
                                        ((fVar332 - fVar376) * fVar281 -
                                        (fVar299 - fVar281) * fVar376));
          uVar124 = -(uint)(0.0 < (fVar369 * (fVar331 - fVar251) - fVar251 * (fVar310 - fVar369)) *
                                  0.0 + (fVar251 * (fVar301 - fVar298) -
                                        (fVar331 - fVar251) * fVar298) * 0.0 +
                                        ((fVar310 - fVar369) * fVar298 -
                                        (fVar301 - fVar298) * fVar369));
          uVar125 = -(uint)(0.0 < (fVar189 * (fVar131 - fVar260) - fVar260 * (fVar341 - fVar189)) *
                                  0.0 + (fVar260 * (fVar302 - fVar307) -
                                        (fVar131 - fVar260) * fVar307) * 0.0 +
                                        ((fVar341 - fVar189) * fVar307 -
                                        (fVar302 - fVar307) * fVar189));
          uVar126 = -(uint)(0.0 < (fVar193 * (fVar191 - fVar261) - fVar261 * (fVar324 - fVar193)) *
                                  0.0 + (fVar261 * (fVar381 - fVar323) -
                                        (fVar191 - fVar261) * fVar323) * 0.0 +
                                        ((fVar324 - fVar193) * fVar323 -
                                        (fVar381 - fVar323) * fVar193));
          local_378._0_4_ =
               (uint)(fVar377 - fVar262) & uVar122 | ~uVar122 & (uint)(fVar185 + fVar326);
          local_378._4_4_ =
               (uint)(fVar129 - fVar330) & uVar124 | ~uVar124 & (uint)(fVar190 + fVar328);
          fStack_370 = (float)((uint)(fVar130 - fVar337) & uVar125 |
                              ~uVar125 & (uint)(fVar194 + fVar338));
          fStack_36c = (float)((uint)(fVar184 - fVar340) & uVar126 |
                              ~uVar126 & (uint)(fVar292 + fVar186));
          fVar194 = (float)((uint)(fVar308 - fVar217) & uVar122 |
                           ~uVar122 & (uint)(local_1a8 + fVar329));
          fVar282 = (float)((uint)(fVar379 - fVar263) & uVar124 |
                           ~uVar124 & (uint)(fStack_1a4 + fVar300));
          fVar292 = (float)((uint)(fVar383 - fVar297) & uVar125 |
                           ~uVar125 & (uint)(fStack_1a0 + fVar319));
          fVar294 = (float)((uint)(fVar309 - fVar280) & uVar126 |
                           ~uVar126 & (uint)(fStack_19c + fVar349));
          fVar364 = (float)((uint)(fVar195 - fVar364) & uVar122 | ~uVar122 & (uint)local_348);
          fVar366 = (float)((uint)(fVar197 - fVar366) & uVar124 | ~uVar124 & (uint)fStack_344);
          fVar368 = (float)((uint)(fVar218 - fVar368) & uVar125 | ~uVar125 & (uint)fStack_340);
          fVar373 = (float)((uint)(fVar220 - fVar373) & uVar126 | ~uVar126 & (uint)fStack_33c);
          fVar329 = (float)((uint)fVar281 & uVar122 | ~uVar122 & (uint)fVar299);
          fVar300 = (float)((uint)fVar298 & uVar124 | ~uVar124 & (uint)fVar301);
          fVar319 = (float)((uint)fVar307 & uVar125 | ~uVar125 & (uint)fVar302);
          fVar349 = (float)((uint)fVar323 & uVar126 | ~uVar126 & (uint)fVar381);
          fVar380 = (float)((uint)fVar376 & uVar122 | ~uVar122 & (uint)fVar332);
          fVar374 = (float)((uint)fVar369 & uVar124 | ~uVar124 & (uint)fVar310);
          fVar377 = (float)((uint)fVar189 & uVar125 | ~uVar125 & (uint)fVar341);
          fVar129 = (float)((uint)fVar193 & uVar126 | ~uVar126 & (uint)fVar324);
          fVar130 = (float)((uint)fVar221 & uVar122 | ~uVar122 & (uint)fVar327);
          fVar184 = (float)((uint)fVar251 & uVar124 | ~uVar124 & (uint)fVar331);
          fVar185 = (float)((uint)fVar260 & uVar125 | ~uVar125 & (uint)fVar131);
          fVar190 = (float)((uint)fVar261 & uVar126 | ~uVar126 & (uint)fVar191);
          fVar299 = (float)((uint)fVar299 & uVar122 | ~uVar122 & (uint)fVar281) -
                    (float)local_378._0_4_;
          fVar301 = (float)((uint)fVar301 & uVar124 | ~uVar124 & (uint)fVar298) -
                    (float)local_378._4_4_;
          fVar302 = (float)((uint)fVar302 & uVar125 | ~uVar125 & (uint)fVar307) - fStack_370;
          fVar381 = (float)((uint)fVar381 & uVar126 | ~uVar126 & (uint)fVar323) - fStack_36c;
          fVar376 = (float)((uint)fVar332 & uVar122 | ~uVar122 & (uint)fVar376) - fVar194;
          fVar369 = (float)((uint)fVar310 & uVar124 | ~uVar124 & (uint)fVar369) - fVar282;
          fVar189 = (float)((uint)fVar341 & uVar125 | ~uVar125 & (uint)fVar189) - fVar292;
          fVar193 = (float)((uint)fVar324 & uVar126 | ~uVar126 & (uint)fVar193) - fVar294;
          fVar308 = (float)((uint)fVar327 & uVar122 | ~uVar122 & (uint)fVar221) - fVar364;
          fVar379 = (float)((uint)fVar331 & uVar124 | ~uVar124 & (uint)fVar251) - fVar366;
          fVar383 = (float)((uint)fVar131 & uVar125 | ~uVar125 & (uint)fVar260) - fVar368;
          fVar309 = (float)((uint)fVar191 & uVar126 | ~uVar126 & (uint)fVar261) - fVar373;
          fVar326 = (float)local_378._0_4_ - fVar329;
          fVar327 = (float)local_378._4_4_ - fVar300;
          fVar328 = fStack_370 - fVar319;
          fVar331 = fStack_36c - fVar349;
          fVar217 = fVar194 - fVar380;
          fVar263 = fVar282 - fVar374;
          fVar297 = fVar292 - fVar377;
          fVar280 = fVar294 - fVar129;
          fVar281 = fVar364 - fVar130;
          fVar298 = fVar366 - fVar184;
          fVar307 = fVar368 - fVar185;
          fVar323 = fVar373 - fVar190;
          fVar332 = (fVar194 * fVar308 - fVar364 * fVar376) * 0.0 +
                    (fVar364 * fVar299 - (float)local_378._0_4_ * fVar308) * 0.0 +
                    ((float)local_378._0_4_ * fVar376 - fVar194 * fVar299);
          fVar310 = (fVar282 * fVar379 - fVar366 * fVar369) * 0.0 +
                    (fVar366 * fVar301 - (float)local_378._4_4_ * fVar379) * 0.0 +
                    ((float)local_378._4_4_ * fVar369 - fVar282 * fVar301);
          auVar257._4_4_ = fVar310;
          auVar257._0_4_ = fVar332;
          fVar341 = (fVar292 * fVar383 - fVar368 * fVar189) * 0.0 +
                    (fVar368 * fVar302 - fStack_370 * fVar383) * 0.0 +
                    (fStack_370 * fVar189 - fVar292 * fVar302);
          fVar324 = (fVar294 * fVar309 - fVar373 * fVar193) * 0.0 +
                    (fVar373 * fVar381 - fStack_36c * fVar309) * 0.0 +
                    (fStack_36c * fVar193 - fVar294 * fVar381);
          auVar361._0_4_ =
               (fVar380 * fVar281 - fVar130 * fVar217) * 0.0 +
               (fVar130 * fVar326 - fVar329 * fVar281) * 0.0 +
               (fVar329 * fVar217 - fVar380 * fVar326);
          auVar361._4_4_ =
               (fVar374 * fVar298 - fVar184 * fVar263) * 0.0 +
               (fVar184 * fVar327 - fVar300 * fVar298) * 0.0 +
               (fVar300 * fVar263 - fVar374 * fVar327);
          auVar361._8_4_ =
               (fVar377 * fVar307 - fVar185 * fVar297) * 0.0 +
               (fVar185 * fVar328 - fVar319 * fVar307) * 0.0 +
               (fVar319 * fVar297 - fVar377 * fVar328);
          auVar361._12_4_ =
               (fVar129 * fVar323 - fVar190 * fVar280) * 0.0 +
               (fVar190 * fVar331 - fVar349 * fVar323) * 0.0 +
               (fVar349 * fVar280 - fVar129 * fVar331);
          auVar257._8_4_ = fVar341;
          auVar257._12_4_ = fVar324;
          auVar198 = maxps(auVar257,auVar361);
          bVar95 = auVar198._0_4_ <= 0.0 && bVar95;
          auVar258._0_4_ = -(uint)bVar95;
          bVar96 = auVar198._4_4_ <= 0.0 && bVar96;
          auVar258._4_4_ = -(uint)bVar96;
          bVar97 = auVar198._8_4_ <= 0.0 && bVar97;
          auVar258._8_4_ = -(uint)bVar97;
          bVar98 = auVar198._12_4_ <= 0.0 && bVar98;
          auVar258._12_4_ = -(uint)bVar98;
          iVar180 = movmskps((int)(bezier_basis1 + lVar115),auVar258);
          if (iVar180 == 0) {
LAB_003a5f6f:
            auVar246._8_8_ = uStack_320;
            auVar246._0_8_ = local_328;
          }
          else {
            fVar329 = ray->tfar;
            fVar319 = fVar217 * fVar308 - fVar281 * fVar376;
            fVar349 = fVar263 * fVar379 - fVar298 * fVar369;
            fVar380 = fVar297 * fVar383 - fVar307 * fVar189;
            fVar374 = fVar280 * fVar309 - fVar323 * fVar193;
            fVar281 = fVar281 * fVar299 - fVar308 * fVar326;
            fVar298 = fVar298 * fVar301 - fVar379 * fVar327;
            fVar300 = fVar307 * fVar302 - fVar383 * fVar328;
            fVar307 = fVar323 * fVar381 - fVar309 * fVar331;
            fVar323 = fVar326 * fVar376 - fVar217 * fVar299;
            fVar376 = fVar327 * fVar369 - fVar263 * fVar301;
            fVar369 = fVar328 * fVar189 - fVar297 * fVar302;
            fVar377 = fVar331 * fVar193 - fVar280 * fVar381;
            auVar245._0_4_ = fVar281 * 0.0 + fVar323;
            auVar245._4_4_ = fVar298 * 0.0 + fVar376;
            auVar245._8_4_ = fVar300 * 0.0 + fVar369;
            auVar245._12_4_ = fVar307 * 0.0 + fVar377;
            auVar296._0_4_ = fVar319 * 0.0 + auVar245._0_4_;
            auVar296._4_4_ = fVar349 * 0.0 + auVar245._4_4_;
            auVar296._8_4_ = fVar380 * 0.0 + auVar245._8_4_;
            auVar296._12_4_ = fVar374 * 0.0 + auVar245._12_4_;
            auVar198 = rcpps(auVar245,auVar296);
            fVar217 = auVar198._0_4_;
            fVar263 = auVar198._4_4_;
            fVar297 = auVar198._8_4_;
            fVar280 = auVar198._12_4_;
            fVar217 = (1.0 - auVar296._0_4_ * fVar217) * fVar217 + fVar217;
            fVar263 = (1.0 - auVar296._4_4_ * fVar263) * fVar263 + fVar263;
            fVar297 = (1.0 - auVar296._8_4_ * fVar297) * fVar297 + fVar297;
            fVar280 = (1.0 - auVar296._12_4_ * fVar280) * fVar280 + fVar280;
            fVar281 = (fVar364 * fVar323 + fVar194 * fVar281 + (float)local_378._0_4_ * fVar319) *
                      fVar217;
            fVar298 = (fVar366 * fVar376 + fVar282 * fVar298 + (float)local_378._4_4_ * fVar349) *
                      fVar263;
            fVar300 = (fVar368 * fVar369 + fVar292 * fVar300 + fStack_370 * fVar380) * fVar297;
            fVar307 = (fVar373 * fVar377 + fVar294 * fVar307 + fStack_36c * fVar374) * fVar280;
            bVar95 = (local_1f8 <= fVar281 && fVar281 <= fVar329) && bVar95;
            auVar277._0_4_ = -(uint)bVar95;
            bVar96 = (fStack_1f4 <= fVar298 && fVar298 <= fVar329) && bVar96;
            auVar277._4_4_ = -(uint)bVar96;
            bVar97 = (fStack_1f0 <= fVar300 && fVar300 <= fVar329) && bVar97;
            auVar277._8_4_ = -(uint)bVar97;
            bVar98 = (fStack_1ec <= fVar307 && fVar307 <= fVar329) && bVar98;
            auVar277._12_4_ = -(uint)bVar98;
            iVar180 = movmskps(iVar180,auVar277);
            if (iVar180 == 0) goto LAB_003a5f6f;
            auVar278._0_8_ =
                 CONCAT44(-(uint)(auVar296._4_4_ != 0.0 && bVar96),
                          -(uint)(auVar296._0_4_ != 0.0 && bVar95));
            auVar278._8_4_ = -(uint)(auVar296._8_4_ != 0.0 && bVar97);
            auVar278._12_4_ = -(uint)(auVar296._12_4_ != 0.0 && bVar98);
            iVar180 = movmskps(iVar180,auVar278);
            auVar246._8_8_ = uStack_320;
            auVar246._0_8_ = local_328;
            if (iVar180 != 0) {
              fVar332 = fVar332 * fVar217;
              fVar310 = fVar310 * fVar263;
              fVar341 = fVar341 * fVar297;
              fVar324 = fVar324 * fVar280;
              local_3d8 = (float)((uint)(1.0 - fVar332) & uVar122 | ~uVar122 & (uint)fVar332);
              fStack_3d4 = (float)((uint)(1.0 - fVar310) & uVar124 | ~uVar124 & (uint)fVar310);
              fStack_3d0 = (float)((uint)(1.0 - fVar341) & uVar125 | ~uVar125 & (uint)fVar341);
              fStack_3cc = (float)((uint)(1.0 - fVar324) & uVar126 | ~uVar126 & (uint)fVar324);
              local_1e8 = (float)(~uVar122 & (uint)(auVar361._0_4_ * fVar217) |
                                 (uint)(1.0 - auVar361._0_4_ * fVar217) & uVar122);
              fStack_1e4 = (float)(~uVar124 & (uint)(auVar361._4_4_ * fVar263) |
                                  (uint)(1.0 - auVar361._4_4_ * fVar263) & uVar124);
              fStack_1e0 = (float)(~uVar125 & (uint)(auVar361._8_4_ * fVar297) |
                                  (uint)(1.0 - auVar361._8_4_ * fVar297) & uVar125);
              fStack_1dc = (float)(~uVar126 & (uint)(auVar361._12_4_ * fVar280) |
                                  (uint)(1.0 - auVar361._12_4_ * fVar280) & uVar126);
              auVar246._8_4_ = auVar278._8_4_;
              auVar246._0_8_ = auVar278._0_8_;
              auVar246._12_4_ = auVar278._12_4_;
              local_3e8 = fVar281;
              fStack_3e4 = fVar298;
              fStack_3e0 = fVar300;
              fStack_3dc = fVar307;
            }
          }
          iVar180 = movmskps(iVar180,auVar246);
          fVar217 = local_368;
          fVar263 = fStack_364;
          fVar297 = fStack_360;
          fVar280 = fStack_35c;
          _local_268 = auVar346;
          _local_228 = auVar353;
          if (iVar180 != 0) {
            fVar329 = (auVar353._0_4_ - (float)local_3a8._0_4_) * local_3d8 + (float)local_3a8._0_4_
            ;
            fVar298 = (auVar353._4_4_ - (float)local_3a8._4_4_) * fStack_3d4 +
                      (float)local_3a8._4_4_;
            fVar300 = (auVar353._8_4_ - (float)uStack_3a0) * fStack_3d0 + (float)uStack_3a0;
            fVar307 = (auVar353._12_4_ - register0x000012cc) * fStack_3cc + register0x000012cc;
            fVar281 = local_330->depth_scale;
            aVar178._0_4_ = -(uint)(fVar281 * (fVar329 + fVar329) < local_3e8) & auVar246._0_4_;
            aVar178._4_4_ = -(uint)(fVar281 * (fVar298 + fVar298) < fStack_3e4) & auVar246._4_4_;
            aVar178._8_4_ = -(uint)(fVar281 * (fVar300 + fVar300) < fStack_3e0) & auVar246._8_4_;
            aVar178._12_4_ = -(uint)(fVar281 * (fVar307 + fVar307) < fStack_3dc) & auVar246._12_4_;
            uVar122 = movmskps((int)local_330,(undefined1  [16])aVar178);
            if (uVar122 != 0) {
              local_1e8 = local_1e8 + local_1e8 + -1.0;
              fStack_1e4 = fStack_1e4 + fStack_1e4 + -1.0;
              fStack_1e0 = fStack_1e0 + fStack_1e0 + -1.0;
              fStack_1dc = fStack_1dc + fStack_1dc + -1.0;
              bhit.T.field_0.v[1] = fStack_3e4;
              bhit.T.field_0.v[0] = local_3e8;
              bhit.T.field_0.v[2] = fStack_3e0;
              bhit.T.field_0.v[3] = fStack_3dc;
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v0.field_0._0_8_ =
                   CONCAT44(fVar343,fVar336);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v0.field_0._8_8_ =
                   CONCAT44(fVar356,fVar348);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v1.field_0._0_8_ =
                   CONCAT44(fStack_244,local_248);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v1.field_0._8_8_ =
                   CONCAT44(fStack_23c,fStack_240);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v2.field_0._0_8_ =
                   CONCAT44(fStack_254,local_258);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v2.field_0._8_8_ =
                   CONCAT44(fStack_24c,fStack_250);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v3.field_0._0_8_ =
                   CONCAT44(fStack_234,local_238);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v3.field_0._8_8_ =
                   CONCAT44(fStack_22c,fStack_230);
              auVar113 = (undefined1  [8])(local_3b0->scene->geometries).items[(long)pRVar118].ptr;
              pRVar114 = local_3b0;
              bhit.U.field_0.v[0] = local_3d8;
              bhit.U.field_0.v[1] = fStack_3d4;
              bhit.U.field_0.v[2] = fStack_3d0;
              bhit.U.field_0.v[3] = fStack_3cc;
              bhit.V.field_0.v[0] = local_1e8;
              bhit.V.field_0.v[1] = fStack_1e4;
              bhit.V.field_0.v[2] = fStack_1e0;
              bhit.V.field_0.v[3] = fStack_1dc;
              bhit.i = uVar123;
              bhit.valid.field_0 = aVar178;
              if ((((Geometry *)auVar113)->mask & ray->mask) == 0) {
                pRVar111 = (RTCIntersectArguments *)0x0;
                bhit.N = iVar249;
              }
              else if ((local_3b0->args->filter != (RTCFilterFunctionN)0x0) ||
                      (pRVar111 = (RTCIntersectArguments *)
                                  CONCAT71((int7)((ulong)local_3b0->args >> 8),1), bhit.N = iVar249,
                      ((Geometry *)auVar113)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar217 = (float)(int)uVar123;
                bhit.vu.field_0.v[0] = (fVar217 + local_3d8 + 0.0) * fVar339;
                bhit.vu.field_0.v[1] = (fVar217 + fStack_3d4 + 1.0) * fVar339;
                bhit.vu.field_0.v[2] = (fVar217 + fStack_3d0 + 2.0) * fVar339;
                bhit.vu.field_0.v[3] = (fVar217 + fStack_3cc + 3.0) * fVar339;
                bhit.vv.field_0._0_8_ = CONCAT44(fStack_1e4,local_1e8);
                bhit.vv.field_0._8_8_ = CONCAT44(fStack_1dc,fStack_1e0);
                bhit.vt.field_0.v[1] = fStack_3e4;
                bhit.vt.field_0.v[0] = local_3e8;
                bhit.vt.field_0.v[2] = fStack_3e0;
                bhit.vt.field_0.v[3] = fStack_3dc;
                uVar110 = (ulong)(uVar122 & 0xff);
                uVar112 = 0;
                if (uVar110 != 0) {
                  for (; ((uVar122 & 0xff) >> uVar112 & 1) == 0; uVar112 = uVar112 + 1) {
                  }
                }
                local_3a8 = auVar113;
                local_380 = lVar119;
                bhit.N = iVar249;
                while (uVar110 != 0) {
                  local_29c = bhit.vu.field_0.v[uVar112];
                  local_298 = bhit.vv.field_0.v[uVar112];
                  local_378._0_4_ = ray->tfar;
                  ray->tfar = bhit.vt.field_0.v[uVar112];
                  args.context = local_3b0->user;
                  fVar217 = 1.0 - local_29c;
                  fVar297 = local_29c * fVar217 + local_29c * fVar217;
                  fVar263 = fVar217 * fVar217 * -3.0;
                  fVar280 = (fVar217 * fVar217 - fVar297) * 3.0;
                  fVar217 = (fVar297 - local_29c * local_29c) * 3.0;
                  fVar297 = local_29c * local_29c * 3.0;
                  local_2a8 = CONCAT44(fVar263 * fVar343 +
                                       fVar280 * fStack_244 +
                                       fVar217 * fStack_254 + fVar297 * fStack_234,
                                       fVar263 * fVar336 +
                                       fVar280 * local_248 +
                                       fVar217 * local_258 + fVar297 * local_238);
                  local_2a0 = fVar263 * fVar348 +
                              fVar280 * fStack_240 + fVar217 * fStack_250 + fVar297 * fStack_230;
                  local_294 = SUB84(local_270,0);
                  local_290 = SUB84(local_350,0);
                  local_28c = (args.context)->instID[0];
                  local_288 = (args.context)->instPrimID[0];
                  local_40c = -1;
                  args.valid = &local_40c;
                  args.geometryUserPtr = ((Geometry *)auVar113)->userPtr;
                  args.hit = (RTCHitN *)&local_2a8;
                  args.N = 1;
                  args.ray = (RTCRayN *)ray;
                  if ((((Geometry *)auVar113)->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*((Geometry *)auVar113)->occlusionFilterN)(&args), pRVar114 = extraout_RDX_01
                     , *args.valid != 0)) {
                    pRVar111 = local_3b0->args;
                    auVar113 = (undefined1  [8])pRVar111;
                    if ((pRVar111->filter == (RTCFilterFunctionN)0x0) ||
                       ((((pRVar111->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT &&
                         (auVar113 = local_3a8,
                         ((ulong)((RTCIntersectArguments *)((long)local_3a8 + 0x20))->intersect &
                         0x40000000000000) == 0)) ||
                        ((*pRVar111->filter)(&args), pRVar114 = extraout_RDX_02, *args.valid != 0)))
                       ) {
                      pRVar111 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)auVar113 >> 8),1);
                      pRVar118 = local_350;
                      lVar119 = local_380;
                      goto LAB_003a5f63;
                    }
                  }
                  ray->tfar = (float)local_378._0_4_;
                  uVar110 = uVar110 ^ 1L << (uVar112 & 0x3f);
                  uVar112 = 0;
                  if (uVar110 != 0) {
                    for (; (uVar110 >> uVar112 & 1) == 0; uVar112 = uVar112 + 1) {
                    }
                  }
                  auVar113 = local_3a8;
                }
                pRVar111 = (RTCIntersectArguments *)0x0;
                pRVar118 = local_350;
                lVar119 = local_380;
              }
LAB_003a5f63:
              bVar121 = bVar121 | (byte)pRVar111;
              fVar217 = local_368;
              fVar263 = fStack_364;
              fVar297 = fStack_360;
              fVar280 = fStack_35c;
            }
          }
        }
        fStack_35c = fVar280;
        fStack_360 = fVar297;
        fStack_364 = fVar263;
        local_368 = fVar217;
      }
    }
    if (bVar121 != 0) break;
    fVar339 = ray->tfar;
    auVar216._4_4_ = -(uint)(fVar183 <= fVar339);
    auVar216._0_4_ = -(uint)(fVar128 <= fVar339);
    auVar216._8_4_ = -(uint)(fVar293 <= fVar339);
    auVar216._12_4_ = -(uint)(fVar188 <= fVar339);
    uVar122 = movmskps(uVar116,auVar216);
  }
  return uVar117 != 0;
}

Assistant:

static __forceinline bool occluded_h(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }